

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  RayK<4> *pRVar73;
  byte bVar74;
  ulong uVar75;
  long lVar76;
  ulong uVar77;
  Geometry *pGVar78;
  bool bVar79;
  uint uVar80;
  Geometry *geometry;
  long lVar81;
  ulong uVar82;
  ulong uVar83;
  float fVar84;
  float fVar85;
  float fVar132;
  float fVar134;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar138;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar139;
  undefined4 uVar140;
  undefined8 uVar141;
  vint4 bi_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  float fVar166;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  float fVar179;
  float fVar180;
  vint4 ai_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar181;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  vint4 ai_1;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  vint4 ai;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  bool local_6e9;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  ulong local_6b8;
  Geometry *local_6b0;
  Precalculations *local_6a8;
  RTCFilterFunctionNArguments local_6a0;
  undefined1 local_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  LinearSpace3fa *local_550;
  Primitive *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  RTCHitN local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_310 [16];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar83 = (ulong)(byte)PVar6;
  lVar23 = uVar83 * 0x25;
  fVar168 = *(float *)(prim + lVar23 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar90 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + lVar23 + 6));
  auVar163._0_4_ = fVar168 * auVar90._0_4_;
  auVar163._4_4_ = fVar168 * auVar90._4_4_;
  auVar163._8_4_ = fVar168 * auVar90._8_4_;
  auVar163._12_4_ = fVar168 * auVar90._12_4_;
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar142._0_4_ = fVar168 * auVar89._0_4_;
  auVar142._4_4_ = fVar168 * auVar89._4_4_;
  auVar142._8_4_ = fVar168 * auVar89._8_4_;
  auVar142._12_4_ = fVar168 * auVar89._12_4_;
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar210 = vcvtdq2ps_avx(auVar210);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar83 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar182._4_4_ = auVar142._0_4_;
  auVar182._0_4_ = auVar142._0_4_;
  auVar182._8_4_ = auVar142._0_4_;
  auVar182._12_4_ = auVar142._0_4_;
  auVar92 = vshufps_avx(auVar142,auVar142,0x55);
  auVar93 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar168 = auVar93._0_4_;
  auVar157._0_4_ = fVar168 * auVar91._0_4_;
  fVar152 = auVar93._4_4_;
  auVar157._4_4_ = fVar152 * auVar91._4_4_;
  fVar167 = auVar93._8_4_;
  auVar157._8_4_ = fVar167 * auVar91._8_4_;
  fVar179 = auVar93._12_4_;
  auVar157._12_4_ = fVar179 * auVar91._12_4_;
  auVar153._0_4_ = auVar18._0_4_ * fVar168;
  auVar153._4_4_ = auVar18._4_4_ * fVar152;
  auVar153._8_4_ = auVar18._8_4_ * fVar167;
  auVar153._12_4_ = auVar18._12_4_ * fVar179;
  auVar143._0_4_ = auVar21._0_4_ * fVar168;
  auVar143._4_4_ = auVar21._4_4_ * fVar152;
  auVar143._8_4_ = auVar21._8_4_ * fVar167;
  auVar143._12_4_ = auVar21._12_4_ * fVar179;
  auVar93 = vfmadd231ps_fma(auVar157,auVar92,auVar89);
  auVar25 = vfmadd231ps_fma(auVar153,auVar92,auVar17);
  auVar92 = vfmadd231ps_fma(auVar143,auVar20,auVar92);
  auVar94 = vfmadd231ps_fma(auVar93,auVar182,auVar90);
  auVar25 = vfmadd231ps_fma(auVar25,auVar182,auVar210);
  auVar26 = vfmadd231ps_fma(auVar92,auVar19,auVar182);
  auVar200._4_4_ = auVar163._0_4_;
  auVar200._0_4_ = auVar163._0_4_;
  auVar200._8_4_ = auVar163._0_4_;
  auVar200._12_4_ = auVar163._0_4_;
  auVar92 = vshufps_avx(auVar163,auVar163,0x55);
  auVar93 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar168 = auVar93._0_4_;
  auVar183._0_4_ = fVar168 * auVar91._0_4_;
  fVar152 = auVar93._4_4_;
  auVar183._4_4_ = fVar152 * auVar91._4_4_;
  fVar167 = auVar93._8_4_;
  auVar183._8_4_ = fVar167 * auVar91._8_4_;
  fVar179 = auVar93._12_4_;
  auVar183._12_4_ = fVar179 * auVar91._12_4_;
  auVar169._0_4_ = auVar18._0_4_ * fVar168;
  auVar169._4_4_ = auVar18._4_4_ * fVar152;
  auVar169._8_4_ = auVar18._8_4_ * fVar167;
  auVar169._12_4_ = auVar18._12_4_ * fVar179;
  auVar164._0_4_ = auVar21._0_4_ * fVar168;
  auVar164._4_4_ = auVar21._4_4_ * fVar152;
  auVar164._8_4_ = auVar21._8_4_ * fVar167;
  auVar164._12_4_ = auVar21._12_4_ * fVar179;
  auVar89 = vfmadd231ps_fma(auVar183,auVar92,auVar89);
  auVar91 = vfmadd231ps_fma(auVar169,auVar92,auVar17);
  auVar17 = vfmadd231ps_fma(auVar164,auVar92,auVar20);
  auVar27 = vfmadd231ps_fma(auVar89,auVar200,auVar90);
  auVar142 = vfmadd231ps_fma(auVar91,auVar200,auVar210);
  auVar192._8_4_ = 0x7fffffff;
  auVar192._0_8_ = 0x7fffffff7fffffff;
  auVar192._12_4_ = 0x7fffffff;
  auVar143 = vfmadd231ps_fma(auVar17,auVar200,auVar19);
  auVar90 = vandps_avx(auVar192,auVar94);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar90,auVar189,1);
  bVar79 = (bool)((byte)uVar82 & 1);
  auVar86._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar94._0_4_;
  bVar79 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar94._4_4_;
  bVar79 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar94._8_4_;
  bVar79 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar94._12_4_;
  auVar90 = vandps_avx(auVar192,auVar25);
  uVar82 = vcmpps_avx512vl(auVar90,auVar189,1);
  bVar79 = (bool)((byte)uVar82 & 1);
  auVar87._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar25._0_4_;
  bVar79 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar25._4_4_;
  bVar79 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar25._8_4_;
  bVar79 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar25._12_4_;
  auVar90 = vandps_avx(auVar192,auVar26);
  uVar82 = vcmpps_avx512vl(auVar90,auVar189,1);
  bVar79 = (bool)((byte)uVar82 & 1);
  auVar88._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar26._0_4_;
  bVar79 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar26._4_4_;
  bVar79 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar26._8_4_;
  bVar79 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar26._12_4_;
  auVar89 = vrcp14ps_avx512vl(auVar86);
  auVar190._8_4_ = 0x3f800000;
  auVar190._0_8_ = &DAT_3f8000003f800000;
  auVar190._12_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar86,auVar89,auVar190);
  auVar94 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vfnmadd213ps_fma(auVar87,auVar89,auVar190);
  auVar26 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar88);
  auVar90 = vfnmadd213ps_fma(auVar88,auVar89,auVar190);
  auVar24 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  fVar168 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  auVar187._4_4_ = fVar168;
  auVar187._0_4_ = fVar168;
  auVar187._8_4_ = fVar168;
  auVar187._12_4_ = fVar168;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar210 = vsubps_avx(auVar89,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar89 = vpmovsxwd_avx(auVar91);
  auVar91 = vfmadd213ps_fma(auVar210,auVar187,auVar90);
  auVar90 = vcvtdq2ps_avx(auVar89);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar89 = vpmovsxwd_avx(auVar210);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar210 = vfmadd213ps_fma(auVar89,auVar187,auVar90);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar90 = vpmovsxwd_avx(auVar17);
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar82 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar83 * 2 + uVar82 + 6);
  auVar89 = vpmovsxwd_avx(auVar18);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar17 = vfmadd213ps_fma(auVar89,auVar187,auVar90);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar90 = vpmovsxwd_avx(auVar19);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar89 = vpmovsxwd_avx(auVar20);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar18 = vfmadd213ps_fma(auVar89,auVar187,auVar90);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar90 = vpmovsxwd_avx(auVar21);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar89 = vpmovsxwd_avx(auVar92);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar19 = vfmadd213ps_fma(auVar89,auVar187,auVar90);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar83) + 6);
  auVar90 = vpmovsxwd_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar89 = vpmovsxwd_avx(auVar25);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar89 = vfmadd213ps_fma(auVar89,auVar187,auVar90);
  auVar90 = vsubps_avx(auVar91,auVar27);
  auVar188._0_4_ = auVar94._0_4_ * auVar90._0_4_;
  auVar188._4_4_ = auVar94._4_4_ * auVar90._4_4_;
  auVar188._8_4_ = auVar94._8_4_ * auVar90._8_4_;
  auVar188._12_4_ = auVar94._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar210,auVar27);
  auVar158._0_4_ = auVar94._0_4_ * auVar90._0_4_;
  auVar158._4_4_ = auVar94._4_4_ * auVar90._4_4_;
  auVar158._8_4_ = auVar94._8_4_ * auVar90._8_4_;
  auVar158._12_4_ = auVar94._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar17,auVar142);
  auVar184._0_4_ = auVar26._0_4_ * auVar90._0_4_;
  auVar184._4_4_ = auVar26._4_4_ * auVar90._4_4_;
  auVar184._8_4_ = auVar26._8_4_ * auVar90._8_4_;
  auVar184._12_4_ = auVar26._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar18,auVar142);
  auVar154._0_4_ = auVar26._0_4_ * auVar90._0_4_;
  auVar154._4_4_ = auVar26._4_4_ * auVar90._4_4_;
  auVar154._8_4_ = auVar26._8_4_ * auVar90._8_4_;
  auVar154._12_4_ = auVar26._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar19,auVar143);
  auVar170._0_4_ = auVar24._0_4_ * auVar90._0_4_;
  auVar170._4_4_ = auVar24._4_4_ * auVar90._4_4_;
  auVar170._8_4_ = auVar24._8_4_ * auVar90._8_4_;
  auVar170._12_4_ = auVar24._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar89,auVar143);
  auVar144._0_4_ = auVar24._0_4_ * auVar90._0_4_;
  auVar144._4_4_ = auVar24._4_4_ * auVar90._4_4_;
  auVar144._8_4_ = auVar24._8_4_ * auVar90._8_4_;
  auVar144._12_4_ = auVar24._12_4_ * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar188,auVar158);
  auVar89 = vpminsd_avx(auVar184,auVar154);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar89 = vpminsd_avx(auVar170,auVar144);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar94._4_4_ = uVar139;
  auVar94._0_4_ = uVar139;
  auVar94._8_4_ = uVar139;
  auVar94._12_4_ = uVar139;
  auVar89 = vmaxps_avx512vl(auVar89,auVar94);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar26._8_4_ = 0x3f7ffffa;
  auVar26._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar26._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar90,auVar26);
  auVar90 = vpmaxsd_avx(auVar188,auVar158);
  auVar89 = vpmaxsd_avx(auVar184,auVar154);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar89 = vpmaxsd_avx(auVar170,auVar144);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar24._4_4_ = uVar139;
  auVar24._0_4_ = uVar139;
  auVar24._8_4_ = uVar139;
  auVar24._12_4_ = uVar139;
  auVar89 = vminps_avx512vl(auVar89,auVar24);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar27._8_4_ = 0x3f800003;
  auVar27._0_8_ = 0x3f8000033f800003;
  auVar27._12_4_ = 0x3f800003;
  auVar90 = vmulps_avx512vl(auVar90,auVar27);
  auVar89 = vpbroadcastd_avx512vl();
  uVar141 = vcmpps_avx512vl(local_170,auVar90,2);
  uVar82 = vpcmpgtd_avx512vl(auVar89,_DAT_01ff0cf0);
  uVar82 = ((byte)uVar141 & 0xf) & uVar82;
  local_6e9 = (char)uVar82 != '\0';
  if (local_6e9) {
    local_550 = pre->ray_space + k;
    local_420 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_6a8 = pre;
    local_548 = prim;
    do {
      lVar23 = 0;
      for (uVar83 = uVar82; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_6b8 = (ulong)*(uint *)(local_548 + 2);
      pGVar78 = (context->scene->geometries).items[local_6b8].ptr;
      local_620._0_8_ = CONCAT44(0,*(uint *)(local_548 + lVar23 * 4 + 6));
      uVar83 = (ulong)*(uint *)(*(long *)&pGVar78->field_0x58 +
                               CONCAT44(0,*(uint *)(local_548 + lVar23 * 4 + 6)) *
                               pGVar78[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar168 = (pGVar78->time_range).lower;
      fVar168 = pGVar78->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar168) /
                ((pGVar78->time_range).upper - fVar168));
      auVar90 = vroundss_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),9);
      auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar78->fnumTimeSegments + -1.0)));
      auVar90 = vmaxss_avx(ZEXT816(0) << 0x20,auVar90);
      fVar168 = fVar168 - auVar90._0_4_;
      _Var8 = pGVar78[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar76 = (long)(int)auVar90._0_4_ * 0x38;
      lVar23 = *(long *)(_Var8 + 0x10 + lVar76);
      lVar81 = *(long *)(_Var8 + 0x38 + lVar76);
      lVar9 = *(long *)(_Var8 + 0x48 + lVar76);
      auVar155._4_4_ = fVar168;
      auVar155._0_4_ = fVar168;
      auVar155._8_4_ = fVar168;
      auVar155._12_4_ = fVar168;
      pfVar3 = (float *)(lVar81 + uVar83 * lVar9);
      auVar193._0_4_ = fVar168 * *pfVar3;
      auVar193._4_4_ = fVar168 * pfVar3[1];
      auVar193._8_4_ = fVar168 * pfVar3[2];
      auVar193._12_4_ = fVar168 * pfVar3[3];
      pfVar3 = (float *)(lVar81 + (uVar83 + 1) * lVar9);
      auVar194._0_4_ = fVar168 * *pfVar3;
      auVar194._4_4_ = fVar168 * pfVar3[1];
      auVar194._8_4_ = fVar168 * pfVar3[2];
      auVar194._12_4_ = fVar168 * pfVar3[3];
      auVar90 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar81 + (uVar83 + 2) * lVar9));
      auVar89 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar81 + lVar9 * (uVar83 + 3)));
      lVar81 = *(long *)(_Var8 + lVar76);
      fVar168 = 1.0 - fVar168;
      auVar145._4_4_ = fVar168;
      auVar145._0_4_ = fVar168;
      auVar145._8_4_ = fVar168;
      auVar145._12_4_ = fVar168;
      local_610 = vfmadd231ps_fma(auVar193,auVar145,*(undefined1 (*) [16])(lVar81 + lVar23 * uVar83)
                                 );
      local_3f0 = vfmadd231ps_fma(auVar194,auVar145,
                                  *(undefined1 (*) [16])(lVar81 + lVar23 * (uVar83 + 1)));
      local_400 = vfmadd231ps_avx512vl
                            (auVar90,auVar145,*(undefined1 (*) [16])(lVar81 + lVar23 * (uVar83 + 2))
                            );
      local_410 = vfmadd231ps_avx512vl
                            (auVar89,auVar145,*(undefined1 (*) [16])(lVar81 + lVar23 * (uVar83 + 3))
                            );
      iVar7 = (int)pGVar78[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar23 = (long)iVar7 * 0x44;
      auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar91 = vsubps_avx(local_610,auVar90);
      uVar139 = auVar91._0_4_;
      auVar159._4_4_ = uVar139;
      auVar159._0_4_ = uVar139;
      auVar159._8_4_ = uVar139;
      auVar159._12_4_ = uVar139;
      auVar89 = vshufps_avx(auVar91,auVar91,0x55);
      aVar4 = (local_550->vx).field_0;
      aVar5 = (local_550->vy).field_0;
      fVar168 = (local_550->vz).field_0.m128[0];
      fVar152 = *(float *)((long)&(local_550->vz).field_0 + 4);
      fVar167 = *(float *)((long)&(local_550->vz).field_0 + 8);
      fVar179 = *(float *)((long)&(local_550->vz).field_0 + 0xc);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar196._0_4_ = fVar168 * auVar91._0_4_;
      auVar196._4_4_ = fVar152 * auVar91._4_4_;
      auVar196._8_4_ = fVar167 * auVar91._8_4_;
      auVar196._12_4_ = fVar179 * auVar91._12_4_;
      auVar89 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar5,auVar89);
      auVar210 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar159);
      auVar91 = vsubps_avx(local_3f0,auVar90);
      uVar139 = auVar91._0_4_;
      auVar160._4_4_ = uVar139;
      auVar160._0_4_ = uVar139;
      auVar160._8_4_ = uVar139;
      auVar160._12_4_ = uVar139;
      auVar89 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar197._0_4_ = fVar168 * auVar91._0_4_;
      auVar197._4_4_ = fVar152 * auVar91._4_4_;
      auVar197._8_4_ = fVar167 * auVar91._8_4_;
      auVar197._12_4_ = fVar179 * auVar91._12_4_;
      auVar89 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar89);
      auVar17 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar160);
      auVar91 = vsubps_avx512vl(local_400,auVar90);
      uVar139 = auVar91._0_4_;
      auVar161._4_4_ = uVar139;
      auVar161._0_4_ = uVar139;
      auVar161._8_4_ = uVar139;
      auVar161._12_4_ = uVar139;
      auVar89 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar198._0_4_ = fVar168 * auVar91._0_4_;
      auVar198._4_4_ = fVar152 * auVar91._4_4_;
      auVar198._8_4_ = fVar167 * auVar91._8_4_;
      auVar198._12_4_ = fVar179 * auVar91._12_4_;
      auVar89 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar89);
      auVar91 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar161);
      auVar89 = vsubps_avx512vl(local_410,auVar90);
      uVar139 = auVar89._0_4_;
      auVar156._4_4_ = uVar139;
      auVar156._0_4_ = uVar139;
      auVar156._8_4_ = uVar139;
      auVar156._12_4_ = uVar139;
      auVar90 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar202._0_4_ = fVar168 * auVar89._0_4_;
      auVar202._4_4_ = fVar152 * auVar89._4_4_;
      auVar202._8_4_ = fVar167 * auVar89._8_4_;
      auVar202._12_4_ = fVar179 * auVar89._12_4_;
      auVar90 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar90);
      auVar18 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar156);
      auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar23);
      uVar139 = auVar210._0_4_;
      local_440._4_4_ = uVar139;
      local_440._0_4_ = uVar139;
      local_440._8_4_ = uVar139;
      local_440._12_4_ = uVar139;
      local_440._16_4_ = uVar139;
      local_440._20_4_ = uVar139;
      local_440._24_4_ = uVar139;
      local_440._28_4_ = uVar139;
      auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x484);
      auVar97._8_4_ = 1;
      auVar97._0_8_ = 0x100000001;
      auVar97._12_4_ = 1;
      auVar97._16_4_ = 1;
      auVar97._20_4_ = 1;
      auVar97._24_4_ = 1;
      auVar97._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar97,ZEXT1632(auVar210));
      local_460 = vbroadcastss_avx512vl(auVar17);
      local_5a0 = vpermps_avx512vl(auVar97,ZEXT1632(auVar17));
      auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x908);
      local_5c0 = vbroadcastss_avx512vl(auVar91);
      local_4a0 = vpermps_avx512vl(auVar97,ZEXT1632(auVar91));
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0xd8c);
      local_4c0 = vbroadcastss_avx512vl(auVar18);
      auVar213 = ZEXT3264(local_4c0);
      local_4e0 = vpermps_avx512vl(auVar97,ZEXT1632(auVar18));
      auVar214 = ZEXT3264(local_4e0);
      auVar97 = vmulps_avx512vl(local_4c0,auVar109);
      auVar98 = vmulps_avx512vl(local_4e0,auVar109);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_5c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,local_4a0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar114,local_460);
      auVar99 = vfmadd231ps_avx512vl(auVar98,auVar114,local_5a0);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar112,local_440);
      auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar23);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x484);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x908);
      auVar101 = vfmadd231ps_avx512vl(auVar99,auVar112,local_3e0);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0xd8c);
      auVar102 = vmulps_avx512vl(local_4c0,auVar99);
      auVar103 = vmulps_avx512vl(local_4e0,auVar99);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_5c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_4a0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_460);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,local_5a0);
      auVar19 = vfmadd231ps_fma(auVar102,auVar97,local_440);
      auVar20 = vfmadd231ps_fma(auVar103,auVar97,local_3e0);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar19),auVar100);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar20),auVar101);
      auVar102 = vmulps_avx512vl(auVar101,auVar103);
      auVar105 = vmulps_avx512vl(auVar100,auVar104);
      auVar102 = vsubps_avx512vl(auVar102,auVar105);
      auVar90 = vshufps_avx(local_610,local_610,0xff);
      uVar141 = auVar90._0_8_;
      local_80._8_8_ = uVar141;
      local_80._0_8_ = uVar141;
      local_80._16_8_ = uVar141;
      local_80._24_8_ = uVar141;
      auVar90 = vshufps_avx(local_3f0,local_3f0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(local_400,local_400,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(local_410,local_410,0xff);
      uVar141 = auVar90._0_8_;
      register0x00001248 = uVar141;
      local_e0 = uVar141;
      register0x00001250 = uVar141;
      register0x00001258 = uVar141;
      auVar105 = vmulps_avx512vl(_local_e0,auVar109);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_a0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_80);
      auVar106 = vmulps_avx512vl(_local_e0,auVar99);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,local_a0);
      auVar21 = vfmadd231ps_fma(auVar106,auVar97,local_80);
      auVar106 = vmulps_avx512vl(auVar104,auVar104);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
      auVar107 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar21));
      auVar107 = vmulps_avx512vl(auVar107,auVar107);
      auVar106 = vmulps_avx512vl(auVar107,auVar106);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar141 = vcmpps_avx512vl(auVar102,auVar106,2);
      auVar90 = vblendps_avx(auVar210,local_610,8);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar89 = vandps_avx512vl(auVar90,auVar92);
      auVar90 = vblendps_avx(auVar17,local_3f0,8);
      auVar90 = vandps_avx512vl(auVar90,auVar92);
      auVar89 = vmaxps_avx(auVar89,auVar90);
      auVar90 = vblendps_avx(auVar91,local_400,8);
      auVar93 = vandps_avx512vl(auVar90,auVar92);
      auVar90 = vblendps_avx(auVar18,local_410,8);
      auVar90 = vandps_avx512vl(auVar90,auVar92);
      auVar90 = vmaxps_avx(auVar93,auVar90);
      auVar90 = vmaxps_avx(auVar89,auVar90);
      auVar89 = vmovshdup_avx(auVar90);
      auVar89 = vmaxss_avx(auVar89,auVar90);
      auVar90 = vshufpd_avx(auVar90,auVar90,1);
      auVar90 = vmaxss_avx(auVar90,auVar89);
      local_630 = vcvtsi2ss_avx512f(local_400,iVar7);
      auVar106._0_4_ = local_630._0_4_;
      auVar106._4_4_ = auVar106._0_4_;
      auVar106._8_4_ = auVar106._0_4_;
      auVar106._12_4_ = auVar106._0_4_;
      auVar106._16_4_ = auVar106._0_4_;
      auVar106._20_4_ = auVar106._0_4_;
      auVar106._24_4_ = auVar106._0_4_;
      auVar106._28_4_ = auVar106._0_4_;
      uVar22 = vcmpps_avx512vl(auVar106,_DAT_02020f40,0xe);
      local_230 = (byte)uVar141 & (byte)uVar22;
      fVar152 = auVar90._0_4_ * 4.7683716e-07;
      auVar102._8_4_ = 2;
      auVar102._0_8_ = 0x200000002;
      auVar102._12_4_ = 2;
      auVar102._16_4_ = 2;
      auVar102._20_4_ = 2;
      auVar102._24_4_ = 2;
      auVar102._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar102,ZEXT1632(auVar210));
      local_120 = vpermps_avx512vl(auVar102,ZEXT1632(auVar17));
      local_140 = vpermps_avx512vl(auVar102,ZEXT1632(auVar91));
      auVar102 = vpermps_avx2(auVar102,ZEXT1632(auVar18));
      fVar168 = *(float *)(ray + k * 4 + 0x30);
      auVar90 = auVar104._0_16_;
      _local_670 = ZEXT416((uint)fVar152);
      if (local_230 == 0) {
        bVar79 = false;
        auVar90 = vxorps_avx512vl(auVar90,auVar90);
        auVar211 = ZEXT1664(auVar90);
        auVar207 = ZEXT3264(local_440);
        auVar208 = ZEXT3264(local_3e0);
        auVar209 = ZEXT3264(local_460);
        auVar206 = ZEXT3264(local_5a0);
        auVar215 = ZEXT3264(local_5c0);
        auVar212 = ZEXT3264(local_4a0);
      }
      else {
        fStack_4fc = 0.0;
        fStack_4f8 = 0.0;
        fStack_4f4 = 0.0;
        auVar99 = vmulps_avx512vl(auVar102,auVar99);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar99);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar97,local_100,auVar98);
        auVar109 = vmulps_avx512vl(auVar102,auVar109);
        auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar109);
        auVar98 = vfmadd213ps_avx512vl(auVar114,local_120,auVar110);
        auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1210);
        auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1694);
        auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1f9c);
        auVar111 = vfmadd213ps_avx512vl(auVar112,local_100,auVar98);
        auVar112 = vmulps_avx512vl(local_4c0,auVar97);
        auVar98 = vmulps_avx512vl(local_4e0,auVar97);
        auVar199._0_4_ = auVar102._0_4_ * auVar97._0_4_;
        auVar199._4_4_ = auVar102._4_4_ * auVar97._4_4_;
        auVar199._8_4_ = auVar102._8_4_ * auVar97._8_4_;
        auVar199._12_4_ = auVar102._12_4_ * auVar97._12_4_;
        auVar199._16_4_ = auVar102._16_4_ * auVar97._16_4_;
        auVar199._20_4_ = auVar102._20_4_ * auVar97._20_4_;
        auVar199._24_4_ = auVar102._24_4_ * auVar97._24_4_;
        auVar199._28_4_ = 0;
        auVar215 = ZEXT3264(local_5c0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,local_5c0);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar109,local_4a0);
        auVar109 = vfmadd231ps_avx512vl(auVar199,local_140,auVar109);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_460);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_5a0);
        auVar98 = vfmadd231ps_avx512vl(auVar109,local_120,auVar110);
        auVar108 = vfmadd231ps_avx512vl(auVar112,auVar114,local_440);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar114,local_3e0);
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1210);
        auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1b18);
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1f9c);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_100,auVar114);
        auVar99 = vmulps_avx512vl(local_4c0,auVar109);
        auVar113 = vmulps_avx512vl(local_4e0,auVar109);
        auVar114._4_4_ = auVar102._4_4_ * auVar109._4_4_;
        auVar114._0_4_ = auVar102._0_4_ * auVar109._0_4_;
        auVar114._8_4_ = auVar102._8_4_ * auVar109._8_4_;
        auVar114._12_4_ = auVar102._12_4_ * auVar109._12_4_;
        auVar114._16_4_ = auVar102._16_4_ * auVar109._16_4_;
        auVar114._20_4_ = auVar102._20_4_ * auVar109._20_4_;
        auVar114._24_4_ = auVar102._24_4_ * auVar109._24_4_;
        auVar114._28_4_ = auVar109._28_4_;
        auVar109 = vfmadd231ps_avx512vl(auVar99,auVar110,local_5c0);
        auVar99 = vfmadd231ps_avx512vl(auVar113,auVar110,local_4a0);
        auVar110 = vfmadd231ps_avx512vl(auVar114,local_140,auVar110);
        auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1694);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_460);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar114,local_5a0);
        auVar114 = vfmadd231ps_avx512vl(auVar110,local_120,auVar114);
        auVar110 = vfmadd231ps_avx512vl(auVar109,auVar112,local_440);
        auVar109 = vfmadd231ps_avx512vl(auVar99,auVar112,local_3e0);
        auVar99 = vfmadd231ps_avx512vl(auVar114,local_100,auVar112);
        auVar203._8_4_ = 0x7fffffff;
        auVar203._0_8_ = 0x7fffffff7fffffff;
        auVar203._12_4_ = 0x7fffffff;
        auVar203._16_4_ = 0x7fffffff;
        auVar203._20_4_ = 0x7fffffff;
        auVar203._24_4_ = 0x7fffffff;
        auVar203._28_4_ = 0x7fffffff;
        auVar112 = vandps_avx(auVar108,auVar203);
        auVar114 = vandps_avx(auVar97,auVar203);
        auVar114 = vmaxps_avx(auVar112,auVar114);
        auVar112 = vandps_avx(auVar98,auVar203);
        auVar112 = vmaxps_avx(auVar114,auVar112);
        auVar98 = vbroadcastss_avx512vl(_local_670);
        uVar83 = vcmpps_avx512vl(auVar112,auVar98,1);
        bVar79 = (bool)((byte)uVar83 & 1);
        auVar113._0_4_ = (float)((uint)bVar79 * auVar103._0_4_ | (uint)!bVar79 * auVar108._0_4_);
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar79 * auVar103._4_4_ | (uint)!bVar79 * auVar108._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar79 * auVar103._8_4_ | (uint)!bVar79 * auVar108._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar79 * auVar103._12_4_ | (uint)!bVar79 * auVar108._12_4_);
        bVar79 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar79 * auVar103._16_4_ | (uint)!bVar79 * auVar108._16_4_);
        bVar79 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar79 * auVar103._20_4_ | (uint)!bVar79 * auVar108._20_4_);
        bVar79 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar79 * auVar103._24_4_ | (uint)!bVar79 * auVar108._24_4_);
        bVar79 = SUB81(uVar83 >> 7,0);
        auVar113._28_4_ = (uint)bVar79 * auVar103._28_4_ | (uint)!bVar79 * auVar108._28_4_;
        bVar79 = (bool)((byte)uVar83 & 1);
        auVar115._0_4_ = (float)((uint)bVar79 * auVar104._0_4_ | (uint)!bVar79 * auVar97._0_4_);
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar79 * auVar104._4_4_ | (uint)!bVar79 * auVar97._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar79 * auVar104._8_4_ | (uint)!bVar79 * auVar97._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar79 * auVar104._12_4_ | (uint)!bVar79 * auVar97._12_4_);
        bVar79 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar79 * auVar104._16_4_ | (uint)!bVar79 * auVar97._16_4_);
        bVar79 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar79 * auVar104._20_4_ | (uint)!bVar79 * auVar97._20_4_);
        bVar79 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar79 * auVar104._24_4_ | (uint)!bVar79 * auVar97._24_4_);
        bVar79 = SUB81(uVar83 >> 7,0);
        auVar115._28_4_ = (uint)bVar79 * auVar104._28_4_ | (uint)!bVar79 * auVar97._28_4_;
        auVar112 = vandps_avx(auVar203,auVar110);
        auVar114 = vandps_avx(auVar109,auVar203);
        auVar114 = vmaxps_avx(auVar112,auVar114);
        auVar112 = vandps_avx(auVar99,auVar203);
        auVar112 = vmaxps_avx(auVar114,auVar112);
        uVar83 = vcmpps_avx512vl(auVar112,auVar98,1);
        bVar79 = (bool)((byte)uVar83 & 1);
        auVar116._0_4_ = (float)((uint)bVar79 * auVar103._0_4_ | (uint)!bVar79 * auVar110._0_4_);
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar79 * auVar103._4_4_ | (uint)!bVar79 * auVar110._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar79 * auVar103._8_4_ | (uint)!bVar79 * auVar110._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar79 * auVar103._12_4_ | (uint)!bVar79 * auVar110._12_4_);
        bVar79 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar79 * auVar103._16_4_ | (uint)!bVar79 * auVar110._16_4_);
        bVar79 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar79 * auVar103._20_4_ | (uint)!bVar79 * auVar110._20_4_);
        bVar79 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar79 * auVar103._24_4_ | (uint)!bVar79 * auVar110._24_4_);
        bVar79 = SUB81(uVar83 >> 7,0);
        auVar116._28_4_ = (uint)bVar79 * auVar103._28_4_ | (uint)!bVar79 * auVar110._28_4_;
        bVar79 = (bool)((byte)uVar83 & 1);
        auVar117._0_4_ = (float)((uint)bVar79 * auVar104._0_4_ | (uint)!bVar79 * auVar109._0_4_);
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar79 * auVar104._4_4_ | (uint)!bVar79 * auVar109._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar79 * auVar104._8_4_ | (uint)!bVar79 * auVar109._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar79 * auVar104._12_4_ | (uint)!bVar79 * auVar109._12_4_);
        bVar79 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar79 * auVar104._16_4_ | (uint)!bVar79 * auVar109._16_4_);
        bVar79 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar79 * auVar104._20_4_ | (uint)!bVar79 * auVar109._20_4_);
        bVar79 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar79 * auVar104._24_4_ | (uint)!bVar79 * auVar109._24_4_);
        bVar79 = SUB81(uVar83 >> 7,0);
        auVar117._28_4_ = (uint)bVar79 * auVar104._28_4_ | (uint)!bVar79 * auVar109._28_4_;
        auVar94 = vxorps_avx512vl(auVar90,auVar90);
        auVar211 = ZEXT1664(auVar94);
        auVar112 = vfmadd213ps_avx512vl(auVar113,auVar113,ZEXT1632(auVar94));
        auVar90 = vfmadd231ps_fma(auVar112,auVar115,auVar115);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar167 = auVar114._0_4_;
        fVar179 = auVar114._4_4_;
        fVar180 = auVar114._8_4_;
        fVar181 = auVar114._12_4_;
        fVar162 = auVar114._16_4_;
        fVar166 = auVar114._20_4_;
        fVar84 = auVar114._24_4_;
        auVar112._4_4_ = fVar179 * fVar179 * fVar179 * auVar90._4_4_ * -0.5;
        auVar112._0_4_ = fVar167 * fVar167 * fVar167 * auVar90._0_4_ * -0.5;
        auVar112._8_4_ = fVar180 * fVar180 * fVar180 * auVar90._8_4_ * -0.5;
        auVar112._12_4_ = fVar181 * fVar181 * fVar181 * auVar90._12_4_ * -0.5;
        auVar112._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar112._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar112._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar112._28_4_ = auVar99._28_4_;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar97,auVar114);
        auVar110._4_4_ = auVar115._4_4_ * auVar112._4_4_;
        auVar110._0_4_ = auVar115._0_4_ * auVar112._0_4_;
        auVar110._8_4_ = auVar115._8_4_ * auVar112._8_4_;
        auVar110._12_4_ = auVar115._12_4_ * auVar112._12_4_;
        auVar110._16_4_ = auVar115._16_4_ * auVar112._16_4_;
        auVar110._20_4_ = auVar115._20_4_ * auVar112._20_4_;
        auVar110._24_4_ = auVar115._24_4_ * auVar112._24_4_;
        auVar110._28_4_ = 0;
        auVar109._4_4_ = auVar112._4_4_ * -auVar113._4_4_;
        auVar109._0_4_ = auVar112._0_4_ * -auVar113._0_4_;
        auVar109._8_4_ = auVar112._8_4_ * -auVar113._8_4_;
        auVar109._12_4_ = auVar112._12_4_ * -auVar113._12_4_;
        auVar109._16_4_ = auVar112._16_4_ * -auVar113._16_4_;
        auVar109._20_4_ = auVar112._20_4_ * -auVar113._20_4_;
        auVar109._24_4_ = auVar112._24_4_ * -auVar113._24_4_;
        auVar109._28_4_ = auVar115._28_4_;
        auVar112 = vmulps_avx512vl(auVar112,ZEXT1632(auVar94));
        auVar103 = ZEXT1632(auVar94);
        auVar114 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar103);
        auVar90 = vfmadd231ps_fma(auVar114,auVar117,auVar117);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar167 = auVar114._0_4_;
        fVar179 = auVar114._4_4_;
        fVar180 = auVar114._8_4_;
        fVar181 = auVar114._12_4_;
        fVar162 = auVar114._16_4_;
        fVar166 = auVar114._20_4_;
        fVar84 = auVar114._24_4_;
        auVar98._4_4_ = fVar179 * fVar179 * fVar179 * auVar90._4_4_ * -0.5;
        auVar98._0_4_ = fVar167 * fVar167 * fVar167 * auVar90._0_4_ * -0.5;
        auVar98._8_4_ = fVar180 * fVar180 * fVar180 * auVar90._8_4_ * -0.5;
        auVar98._12_4_ = fVar181 * fVar181 * fVar181 * auVar90._12_4_ * -0.5;
        auVar98._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar98._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar98._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar98._28_4_ = 0;
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar114);
        auVar108._4_4_ = auVar117._4_4_ * auVar97._4_4_;
        auVar108._0_4_ = auVar117._0_4_ * auVar97._0_4_;
        auVar108._8_4_ = auVar117._8_4_ * auVar97._8_4_;
        auVar108._12_4_ = auVar117._12_4_ * auVar97._12_4_;
        auVar108._16_4_ = auVar117._16_4_ * auVar97._16_4_;
        auVar108._20_4_ = auVar117._20_4_ * auVar97._20_4_;
        auVar108._24_4_ = auVar117._24_4_ * auVar97._24_4_;
        auVar108._28_4_ = auVar114._28_4_;
        auVar99._4_4_ = -auVar116._4_4_ * auVar97._4_4_;
        auVar99._0_4_ = -auVar116._0_4_ * auVar97._0_4_;
        auVar99._8_4_ = -auVar116._8_4_ * auVar97._8_4_;
        auVar99._12_4_ = -auVar116._12_4_ * auVar97._12_4_;
        auVar99._16_4_ = -auVar116._16_4_ * auVar97._16_4_;
        auVar99._20_4_ = -auVar116._20_4_ * auVar97._20_4_;
        auVar99._24_4_ = -auVar116._24_4_ * auVar97._24_4_;
        auVar99._28_4_ = auVar116._28_4_ ^ 0x80000000;
        auVar114 = vmulps_avx512vl(auVar97,auVar103);
        auVar90 = vfmadd213ps_fma(auVar110,auVar105,auVar100);
        auVar89 = vfmadd213ps_fma(auVar109,auVar105,auVar101);
        auVar97 = vfmadd213ps_avx512vl(auVar112,auVar105,auVar111);
        auVar98 = vfmadd213ps_avx512vl(auVar108,ZEXT1632(auVar21),ZEXT1632(auVar19));
        auVar92 = vfnmadd213ps_fma(auVar110,auVar105,auVar100);
        auVar100 = ZEXT1632(auVar21);
        auVar91 = vfmadd213ps_fma(auVar99,auVar100,ZEXT1632(auVar20));
        auVar93 = vfnmadd213ps_fma(auVar109,auVar105,auVar101);
        auVar210 = vfmadd213ps_fma(auVar114,auVar100,auVar107);
        auVar110 = vfnmadd231ps_avx512vl(auVar111,auVar105,auVar112);
        auVar19 = vfnmadd213ps_fma(auVar108,auVar100,ZEXT1632(auVar19));
        auVar20 = vfnmadd213ps_fma(auVar99,auVar100,ZEXT1632(auVar20));
        auVar25 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar21),auVar114);
        auVar114 = vsubps_avx512vl(auVar98,ZEXT1632(auVar92));
        auVar112 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar93));
        auVar109 = vsubps_avx512vl(ZEXT1632(auVar210),auVar110);
        auVar108 = vmulps_avx512vl(auVar112,auVar110);
        auVar17 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar93),auVar109);
        auVar100._4_4_ = auVar92._4_4_ * auVar109._4_4_;
        auVar100._0_4_ = auVar92._0_4_ * auVar109._0_4_;
        auVar100._8_4_ = auVar92._8_4_ * auVar109._8_4_;
        auVar100._12_4_ = auVar92._12_4_ * auVar109._12_4_;
        auVar100._16_4_ = auVar109._16_4_ * 0.0;
        auVar100._20_4_ = auVar109._20_4_ * 0.0;
        auVar100._24_4_ = auVar109._24_4_ * 0.0;
        auVar100._28_4_ = auVar109._28_4_;
        auVar109 = vfmsub231ps_avx512vl(auVar100,auVar110,auVar114);
        auVar101._4_4_ = auVar93._4_4_ * auVar114._4_4_;
        auVar101._0_4_ = auVar93._0_4_ * auVar114._0_4_;
        auVar101._8_4_ = auVar93._8_4_ * auVar114._8_4_;
        auVar101._12_4_ = auVar93._12_4_ * auVar114._12_4_;
        auVar101._16_4_ = auVar114._16_4_ * 0.0;
        auVar101._20_4_ = auVar114._20_4_ * 0.0;
        auVar101._24_4_ = auVar114._24_4_ * 0.0;
        auVar101._28_4_ = auVar114._28_4_;
        auVar18 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar92),auVar112);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar103,auVar109);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,ZEXT1632(auVar17));
        auVar113 = ZEXT1632(auVar94);
        uVar83 = vcmpps_avx512vl(auVar112,auVar113,2);
        bVar74 = (byte)uVar83;
        fVar84 = (float)((uint)(bVar74 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar19._0_4_);
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar132 = (float)((uint)bVar79 * auVar90._4_4_ | (uint)!bVar79 * auVar19._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar134 = (float)((uint)bVar79 * auVar90._8_4_ | (uint)!bVar79 * auVar19._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar136 = (float)((uint)bVar79 * auVar90._12_4_ | (uint)!bVar79 * auVar19._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar84))));
        fVar85 = (float)((uint)(bVar74 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar20._0_4_);
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar133 = (float)((uint)bVar79 * auVar89._4_4_ | (uint)!bVar79 * auVar20._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar135 = (float)((uint)bVar79 * auVar89._8_4_ | (uint)!bVar79 * auVar20._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar137 = (float)((uint)bVar79 * auVar89._12_4_ | (uint)!bVar79 * auVar20._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar85))));
        auVar111._0_4_ =
             (float)((uint)(bVar74 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar25._0_4_)
        ;
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar79 * auVar97._4_4_ | (uint)!bVar79 * auVar25._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar79 * auVar97._8_4_ | (uint)!bVar79 * auVar25._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar79 * auVar97._12_4_ | (uint)!bVar79 * auVar25._12_4_);
        fVar167 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar97._16_4_);
        auVar111._16_4_ = fVar167;
        fVar179 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar97._20_4_);
        auVar111._20_4_ = fVar179;
        fVar180 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar97._24_4_);
        auVar111._24_4_ = fVar180;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar97._28_4_;
        auVar111._28_4_ = iVar1;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar92),auVar98);
        auVar118._0_4_ =
             (uint)(bVar74 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar17._0_4_;
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar79 * auVar114._4_4_ | (uint)!bVar79 * auVar17._4_4_;
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar79 * auVar114._8_4_ | (uint)!bVar79 * auVar17._8_4_;
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar79 * auVar114._12_4_ | (uint)!bVar79 * auVar17._12_4_;
        auVar118._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_;
        auVar118._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_;
        auVar118._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_;
        auVar118._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar91));
        auVar119._0_4_ =
             (float)((uint)(bVar74 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar89._0_4_
                    );
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar79 * auVar114._4_4_ | (uint)!bVar79 * auVar89._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar79 * auVar114._8_4_ | (uint)!bVar79 * auVar89._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar79 * auVar114._12_4_ | (uint)!bVar79 * auVar89._12_4_);
        fVar181 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_);
        auVar119._16_4_ = fVar181;
        fVar166 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_);
        auVar119._20_4_ = fVar166;
        fVar162 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_);
        auVar119._24_4_ = fVar162;
        auVar119._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar210));
        auVar120._0_4_ =
             (float)((uint)(bVar74 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar97._0_4_
                    );
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar79 * auVar114._4_4_ | (uint)!bVar79 * auVar97._4_4_);
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar79 * auVar114._8_4_ | (uint)!bVar79 * auVar97._8_4_);
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar79 * auVar114._12_4_ | (uint)!bVar79 * auVar97._12_4_);
        bVar79 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar79 * auVar114._16_4_ | (uint)!bVar79 * auVar97._16_4_);
        bVar79 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar79 * auVar114._20_4_ | (uint)!bVar79 * auVar97._20_4_);
        bVar79 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar79 * auVar114._24_4_ | (uint)!bVar79 * auVar97._24_4_);
        bVar79 = SUB81(uVar83 >> 7,0);
        auVar120._28_4_ = (uint)bVar79 * auVar114._28_4_ | (uint)!bVar79 * auVar97._28_4_;
        auVar121._0_4_ =
             (uint)(bVar74 & 1) * (int)auVar92._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar98._0_4_;
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar79 * (int)auVar92._4_4_ | (uint)!bVar79 * auVar98._4_4_;
        bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar79 * (int)auVar92._8_4_ | (uint)!bVar79 * auVar98._8_4_;
        bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar79 * (int)auVar92._12_4_ | (uint)!bVar79 * auVar98._12_4_;
        auVar121._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar98._16_4_;
        auVar121._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar98._20_4_;
        auVar121._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar98._24_4_;
        auVar121._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar98._28_4_;
        bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._0_4_ =
             (uint)(bVar74 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar210._0_4_;
        bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar11 * auVar110._4_4_ | (uint)!bVar11 * auVar210._4_4_;
        bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar11 * auVar110._8_4_ | (uint)!bVar11 * auVar210._8_4_;
        bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar11 * auVar110._12_4_ | (uint)!bVar11 * auVar210._12_4_;
        auVar122._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar110._16_4_;
        auVar122._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar110._20_4_;
        auVar122._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar110._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar110._28_4_;
        auVar122._28_4_ = iVar2;
        auVar100 = vsubps_avx512vl(auVar121,auVar108);
        auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar93._12_4_ |
                                                 (uint)!bVar14 * auVar91._12_4_,
                                                 CONCAT48((uint)bVar12 * (int)auVar93._8_4_ |
                                                          (uint)!bVar12 * auVar91._8_4_,
                                                          CONCAT44((uint)bVar79 * (int)auVar93._4_4_
                                                                   | (uint)!bVar79 * auVar91._4_4_,
                                                                   (uint)(bVar74 & 1) *
                                                                   (int)auVar93._0_4_ |
                                                                   (uint)!(bool)(bVar74 & 1) *
                                                                   auVar91._0_4_)))),auVar99);
        auVar110 = vsubps_avx(auVar122,auVar111);
        auVar109 = vsubps_avx(auVar108,auVar118);
        auVar97 = vsubps_avx(auVar99,auVar119);
        auVar98 = vsubps_avx(auVar111,auVar120);
        auVar103._4_4_ = auVar110._4_4_ * fVar132;
        auVar103._0_4_ = auVar110._0_4_ * fVar84;
        auVar103._8_4_ = auVar110._8_4_ * fVar134;
        auVar103._12_4_ = auVar110._12_4_ * fVar136;
        auVar103._16_4_ = auVar110._16_4_ * 0.0;
        auVar103._20_4_ = auVar110._20_4_ * 0.0;
        auVar103._24_4_ = auVar110._24_4_ * 0.0;
        auVar103._28_4_ = iVar2;
        auVar90 = vfmsub231ps_fma(auVar103,auVar111,auVar100);
        auVar104._4_4_ = fVar133 * auVar100._4_4_;
        auVar104._0_4_ = fVar85 * auVar100._0_4_;
        auVar104._8_4_ = fVar135 * auVar100._8_4_;
        auVar104._12_4_ = fVar137 * auVar100._12_4_;
        auVar104._16_4_ = auVar100._16_4_ * 0.0;
        auVar104._20_4_ = auVar100._20_4_ * 0.0;
        auVar104._24_4_ = auVar100._24_4_ * 0.0;
        auVar104._28_4_ = auVar112._28_4_;
        auVar89 = vfmsub231ps_fma(auVar104,auVar108,auVar114);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar113,ZEXT1632(auVar90));
        auVar175._0_4_ = auVar114._0_4_ * auVar111._0_4_;
        auVar175._4_4_ = auVar114._4_4_ * auVar111._4_4_;
        auVar175._8_4_ = auVar114._8_4_ * auVar111._8_4_;
        auVar175._12_4_ = auVar114._12_4_ * auVar111._12_4_;
        auVar175._16_4_ = auVar114._16_4_ * fVar167;
        auVar175._20_4_ = auVar114._20_4_ * fVar179;
        auVar175._24_4_ = auVar114._24_4_ * fVar180;
        auVar175._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar175,auVar99,auVar110);
        auVar101 = vfmadd231ps_avx512vl(auVar112,auVar113,ZEXT1632(auVar90));
        auVar112 = vmulps_avx512vl(auVar98,auVar118);
        auVar112 = vfmsub231ps_avx512vl(auVar112,auVar109,auVar120);
        auVar107._4_4_ = auVar97._4_4_ * auVar120._4_4_;
        auVar107._0_4_ = auVar97._0_4_ * auVar120._0_4_;
        auVar107._8_4_ = auVar97._8_4_ * auVar120._8_4_;
        auVar107._12_4_ = auVar97._12_4_ * auVar120._12_4_;
        auVar107._16_4_ = auVar97._16_4_ * auVar120._16_4_;
        auVar107._20_4_ = auVar97._20_4_ * auVar120._20_4_;
        auVar107._24_4_ = auVar97._24_4_ * auVar120._24_4_;
        auVar107._28_4_ = auVar120._28_4_;
        auVar90 = vfmsub231ps_fma(auVar107,auVar119,auVar98);
        auVar176._0_4_ = auVar119._0_4_ * auVar109._0_4_;
        auVar176._4_4_ = auVar119._4_4_ * auVar109._4_4_;
        auVar176._8_4_ = auVar119._8_4_ * auVar109._8_4_;
        auVar176._12_4_ = auVar119._12_4_ * auVar109._12_4_;
        auVar176._16_4_ = fVar181 * auVar109._16_4_;
        auVar176._20_4_ = fVar166 * auVar109._20_4_;
        auVar176._24_4_ = fVar162 * auVar109._24_4_;
        auVar176._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar176,auVar97,auVar118);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar113,auVar112);
        auVar103 = vfmadd231ps_avx512vl(auVar112,auVar113,ZEXT1632(auVar90));
        auVar112 = vmaxps_avx(auVar101,auVar103);
        uVar141 = vcmpps_avx512vl(auVar112,auVar113,2);
        local_230 = local_230 & (byte)uVar141;
        auVar207 = ZEXT3264(local_440);
        auVar208 = ZEXT3264(local_3e0);
        auVar209 = ZEXT3264(local_460);
        auVar206 = ZEXT3264(local_5a0);
        auVar201 = ZEXT1664(_local_670);
        if (local_230 == 0) {
          local_230 = 0;
        }
        else {
          auVar38._4_4_ = auVar98._4_4_ * auVar114._4_4_;
          auVar38._0_4_ = auVar98._0_4_ * auVar114._0_4_;
          auVar38._8_4_ = auVar98._8_4_ * auVar114._8_4_;
          auVar38._12_4_ = auVar98._12_4_ * auVar114._12_4_;
          auVar38._16_4_ = auVar98._16_4_ * auVar114._16_4_;
          auVar38._20_4_ = auVar98._20_4_ * auVar114._20_4_;
          auVar38._24_4_ = auVar98._24_4_ * auVar114._24_4_;
          auVar38._28_4_ = auVar112._28_4_;
          auVar91 = vfmsub231ps_fma(auVar38,auVar97,auVar110);
          auVar39._4_4_ = auVar110._4_4_ * auVar109._4_4_;
          auVar39._0_4_ = auVar110._0_4_ * auVar109._0_4_;
          auVar39._8_4_ = auVar110._8_4_ * auVar109._8_4_;
          auVar39._12_4_ = auVar110._12_4_ * auVar109._12_4_;
          auVar39._16_4_ = auVar110._16_4_ * auVar109._16_4_;
          auVar39._20_4_ = auVar110._20_4_ * auVar109._20_4_;
          auVar39._24_4_ = auVar110._24_4_ * auVar109._24_4_;
          auVar39._28_4_ = auVar110._28_4_;
          auVar89 = vfmsub231ps_fma(auVar39,auVar100,auVar98);
          auVar40._4_4_ = auVar97._4_4_ * auVar100._4_4_;
          auVar40._0_4_ = auVar97._0_4_ * auVar100._0_4_;
          auVar40._8_4_ = auVar97._8_4_ * auVar100._8_4_;
          auVar40._12_4_ = auVar97._12_4_ * auVar100._12_4_;
          auVar40._16_4_ = auVar97._16_4_ * auVar100._16_4_;
          auVar40._20_4_ = auVar97._20_4_ * auVar100._20_4_;
          auVar40._24_4_ = auVar97._24_4_ * auVar100._24_4_;
          auVar40._28_4_ = auVar97._28_4_;
          auVar210 = vfmsub231ps_fma(auVar40,auVar109,auVar114);
          auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar210));
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar91),auVar113);
          auVar114 = vrcp14ps_avx512vl(auVar112);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = &DAT_3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar31._16_4_ = 0x3f800000;
          auVar31._20_4_ = 0x3f800000;
          auVar31._24_4_ = 0x3f800000;
          auVar31._28_4_ = 0x3f800000;
          auVar110 = vfnmadd213ps_avx512vl(auVar114,auVar112,auVar31);
          auVar90 = vfmadd132ps_fma(auVar110,auVar114,auVar114);
          auVar41._4_4_ = auVar210._4_4_ * auVar111._4_4_;
          auVar41._0_4_ = auVar210._0_4_ * auVar111._0_4_;
          auVar41._8_4_ = auVar210._8_4_ * auVar111._8_4_;
          auVar41._12_4_ = auVar210._12_4_ * auVar111._12_4_;
          auVar41._16_4_ = fVar167 * 0.0;
          auVar41._20_4_ = fVar179 * 0.0;
          auVar41._24_4_ = fVar180 * 0.0;
          auVar41._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar41,auVar99,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar108,ZEXT1632(auVar91));
          fVar167 = auVar90._0_4_;
          fVar179 = auVar90._4_4_;
          fVar180 = auVar90._8_4_;
          fVar181 = auVar90._12_4_;
          auVar114 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar181,
                                        CONCAT48(auVar89._8_4_ * fVar180,
                                                 CONCAT44(auVar89._4_4_ * fVar179,
                                                          auVar89._0_4_ * fVar167))));
          auVar191._4_4_ = fVar168;
          auVar191._0_4_ = fVar168;
          auVar191._8_4_ = fVar168;
          auVar191._12_4_ = fVar168;
          auVar191._16_4_ = fVar168;
          auVar191._20_4_ = fVar168;
          auVar191._24_4_ = fVar168;
          auVar191._28_4_ = fVar168;
          uVar141 = vcmpps_avx512vl(auVar191,auVar114,2);
          uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar32._4_4_ = uVar139;
          auVar32._0_4_ = uVar139;
          auVar32._8_4_ = uVar139;
          auVar32._12_4_ = uVar139;
          auVar32._16_4_ = uVar139;
          auVar32._20_4_ = uVar139;
          auVar32._24_4_ = uVar139;
          auVar32._28_4_ = uVar139;
          uVar22 = vcmpps_avx512vl(auVar114,auVar32,2);
          local_230 = (byte)uVar141 & (byte)uVar22 & local_230;
          if (local_230 != 0) {
            uVar141 = vcmpps_avx512vl(auVar112,auVar113,4);
            if ((local_230 & (byte)uVar141) != 0) {
              local_230 = local_230 & (byte)uVar141;
              fVar162 = auVar101._0_4_ * fVar167;
              fVar166 = auVar101._4_4_ * fVar179;
              auVar42._4_4_ = fVar166;
              auVar42._0_4_ = fVar162;
              fVar84 = auVar101._8_4_ * fVar180;
              auVar42._8_4_ = fVar84;
              fVar85 = auVar101._12_4_ * fVar181;
              auVar42._12_4_ = fVar85;
              fVar132 = auVar101._16_4_ * 0.0;
              auVar42._16_4_ = fVar132;
              fVar133 = auVar101._20_4_ * 0.0;
              auVar42._20_4_ = fVar133;
              fVar134 = auVar101._24_4_ * 0.0;
              auVar42._24_4_ = fVar134;
              auVar42._28_4_ = auVar101._28_4_;
              fVar167 = auVar103._0_4_ * fVar167;
              fVar179 = auVar103._4_4_ * fVar179;
              auVar43._4_4_ = fVar179;
              auVar43._0_4_ = fVar167;
              fVar180 = auVar103._8_4_ * fVar180;
              auVar43._8_4_ = fVar180;
              fVar181 = auVar103._12_4_ * fVar181;
              auVar43._12_4_ = fVar181;
              fVar135 = auVar103._16_4_ * 0.0;
              auVar43._16_4_ = fVar135;
              fVar136 = auVar103._20_4_ * 0.0;
              auVar43._20_4_ = fVar136;
              fVar137 = auVar103._24_4_ * 0.0;
              auVar43._24_4_ = fVar137;
              auVar43._28_4_ = auVar103._28_4_;
              auVar185._8_4_ = 0x3f800000;
              auVar185._0_8_ = &DAT_3f8000003f800000;
              auVar185._12_4_ = 0x3f800000;
              auVar185._16_4_ = 0x3f800000;
              auVar185._20_4_ = 0x3f800000;
              auVar185._24_4_ = 0x3f800000;
              auVar185._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar185,auVar42);
              local_5e0._0_4_ =
                   (uint)(bVar74 & 1) * (int)fVar162 | (uint)!(bool)(bVar74 & 1) * auVar112._0_4_;
              bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
              local_5e0._4_4_ = (uint)bVar79 * (int)fVar166 | (uint)!bVar79 * auVar112._4_4_;
              bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
              local_5e0._8_4_ = (uint)bVar79 * (int)fVar84 | (uint)!bVar79 * auVar112._8_4_;
              bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
              local_5e0._12_4_ = (uint)bVar79 * (int)fVar85 | (uint)!bVar79 * auVar112._12_4_;
              bVar79 = (bool)((byte)(uVar83 >> 4) & 1);
              local_5e0._16_4_ = (uint)bVar79 * (int)fVar132 | (uint)!bVar79 * auVar112._16_4_;
              bVar79 = (bool)((byte)(uVar83 >> 5) & 1);
              local_5e0._20_4_ = (uint)bVar79 * (int)fVar133 | (uint)!bVar79 * auVar112._20_4_;
              bVar79 = (bool)((byte)(uVar83 >> 6) & 1);
              local_5e0._24_4_ = (uint)bVar79 * (int)fVar134 | (uint)!bVar79 * auVar112._24_4_;
              bVar79 = SUB81(uVar83 >> 7,0);
              local_5e0._28_4_ = (uint)bVar79 * auVar101._28_4_ | (uint)!bVar79 * auVar112._28_4_;
              auVar112 = vsubps_avx(auVar185,auVar43);
              local_1a0._0_4_ =
                   (uint)(bVar74 & 1) * (int)fVar167 | (uint)!(bool)(bVar74 & 1) * auVar112._0_4_;
              bVar79 = (bool)((byte)(uVar83 >> 1) & 1);
              local_1a0._4_4_ = (uint)bVar79 * (int)fVar179 | (uint)!bVar79 * auVar112._4_4_;
              bVar79 = (bool)((byte)(uVar83 >> 2) & 1);
              local_1a0._8_4_ = (uint)bVar79 * (int)fVar180 | (uint)!bVar79 * auVar112._8_4_;
              bVar79 = (bool)((byte)(uVar83 >> 3) & 1);
              local_1a0._12_4_ = (uint)bVar79 * (int)fVar181 | (uint)!bVar79 * auVar112._12_4_;
              bVar79 = (bool)((byte)(uVar83 >> 4) & 1);
              local_1a0._16_4_ = (uint)bVar79 * (int)fVar135 | (uint)!bVar79 * auVar112._16_4_;
              bVar79 = (bool)((byte)(uVar83 >> 5) & 1);
              local_1a0._20_4_ = (uint)bVar79 * (int)fVar136 | (uint)!bVar79 * auVar112._20_4_;
              bVar79 = (bool)((byte)(uVar83 >> 6) & 1);
              local_1a0._24_4_ = (uint)bVar79 * (int)fVar137 | (uint)!bVar79 * auVar112._24_4_;
              bVar79 = SUB81(uVar83 >> 7,0);
              local_1a0._28_4_ = (uint)bVar79 * auVar103._28_4_ | (uint)!bVar79 * auVar112._28_4_;
              local_600 = auVar114;
              goto LAB_01c4af7d;
            }
          }
          local_230 = 0;
        }
LAB_01c4af7d:
        auVar214 = ZEXT3264(local_4e0);
        auVar213 = ZEXT3264(local_4c0);
        auVar212 = ZEXT3264(local_4a0);
        auVar205 = ZEXT3264(auVar102);
        if (local_230 != 0) {
          auVar112 = vsubps_avx(ZEXT1632(auVar21),auVar105);
          auVar90 = vfmadd213ps_fma(auVar112,local_5e0,auVar105);
          uVar139 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
          auVar105._4_4_ = uVar139;
          auVar105._0_4_ = uVar139;
          auVar105._8_4_ = uVar139;
          auVar105._12_4_ = uVar139;
          auVar105._16_4_ = uVar139;
          auVar105._20_4_ = uVar139;
          auVar105._24_4_ = uVar139;
          auVar105._28_4_ = uVar139;
          auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                        CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                 CONCAT44(auVar90._4_4_ +
                                                                          auVar90._4_4_,
                                                                          auVar90._0_4_ +
                                                                          auVar90._0_4_)))),auVar105
                                    );
          uVar141 = vcmpps_avx512vl(local_600,auVar112,6);
          local_230 = local_230 & (byte)uVar141;
          if (local_230 != 0) {
            auVar150._8_4_ = 0xbf800000;
            auVar150._0_8_ = 0xbf800000bf800000;
            auVar150._12_4_ = 0xbf800000;
            auVar150._16_4_ = 0xbf800000;
            auVar150._20_4_ = 0xbf800000;
            auVar150._24_4_ = 0xbf800000;
            auVar150._28_4_ = 0xbf800000;
            auVar33._8_4_ = 0x40000000;
            auVar33._0_8_ = 0x4000000040000000;
            auVar33._12_4_ = 0x40000000;
            auVar33._16_4_ = 0x40000000;
            auVar33._20_4_ = 0x40000000;
            auVar33._24_4_ = 0x40000000;
            auVar33._28_4_ = 0x40000000;
            local_2c0 = vfmadd132ps_avx512vl(local_1a0,auVar150,auVar33);
            local_1a0 = local_2c0;
            auVar112 = local_1a0;
            local_280 = 0;
            local_270 = local_610._0_8_;
            uStack_268 = local_610._8_8_;
            local_260 = local_3f0._0_8_;
            uStack_258 = local_3f0._8_8_;
            local_250 = local_400._0_8_;
            uStack_248 = local_400._8_8_;
            local_240 = local_410._0_8_;
            uStack_238 = local_410._8_8_;
            if ((pGVar78->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar79 = true, pGVar78->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar152 = 1.0 / auVar106._0_4_;
                local_220[0] = fVar152 * (local_5e0._0_4_ + 0.0);
                local_220[1] = fVar152 * (local_5e0._4_4_ + 1.0);
                local_220[2] = fVar152 * (local_5e0._8_4_ + 2.0);
                local_220[3] = fVar152 * (local_5e0._12_4_ + 3.0);
                fStack_210 = fVar152 * (local_5e0._16_4_ + 4.0);
                fStack_20c = fVar152 * (local_5e0._20_4_ + 5.0);
                fStack_208 = fVar152 * (local_5e0._24_4_ + 6.0);
                fStack_204 = local_5e0._28_4_ + 7.0;
                local_1a0._0_8_ = local_2c0._0_8_;
                local_1a0._8_8_ = local_2c0._8_8_;
                local_1a0._16_8_ = local_2c0._16_8_;
                local_1a0._24_8_ = local_2c0._24_8_;
                local_200 = local_1a0._0_8_;
                uStack_1f8 = local_1a0._8_8_;
                uStack_1f0 = local_1a0._16_8_;
                uStack_1e8 = local_1a0._24_8_;
                local_1e0 = local_600;
                local_3c0 = 0;
                uVar77 = (ulong)local_230;
                for (uVar83 = uVar77; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000)
                {
                  local_3c0 = local_3c0 + 1;
                }
                local_640 = vpbroadcastd_avx512vl();
                local_650 = local_3f0._0_4_;
                uStack_64c = local_3f0._4_4_;
                uStack_648 = local_3f0._8_8_;
                local_660 = vpbroadcastd_avx512vl();
                local_560 = local_400._0_8_;
                uStack_558 = local_400._8_8_;
                local_570 = local_410._0_4_;
                fStack_56c = local_410._4_4_;
                fStack_568 = local_410._8_4_;
                fStack_564 = local_410._12_4_;
                bVar79 = true;
                local_500 = fVar168;
                local_480 = auVar102;
                local_2e0 = local_5e0;
                local_2a0 = local_600;
                local_27c = iVar7;
                local_1a0 = auVar112;
                do {
                  auVar210 = auVar211._0_16_;
                  uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar152 = local_220[local_3c0];
                  local_340._4_4_ = fVar152;
                  local_340._0_4_ = fVar152;
                  local_340._8_4_ = fVar152;
                  local_340._12_4_ = fVar152;
                  local_330 = *(undefined4 *)((long)&local_200 + local_3c0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + local_3c0 * 4);
                  local_6a0.context = context->user;
                  fVar167 = 1.0 - fVar152;
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar167),auVar28);
                  auVar90 = ZEXT416((uint)(fVar152 * fVar167 * 4.0));
                  auVar89 = vfnmsub213ss_fma(local_340,local_340,auVar90);
                  auVar90 = vfmadd213ss_fma(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),auVar90);
                  fVar167 = fVar167 * auVar91._0_4_ * 0.5;
                  fVar179 = auVar89._0_4_ * 0.5;
                  fVar180 = auVar90._0_4_ * 0.5;
                  fVar152 = fVar152 * fVar152 * 0.5;
                  auVar171._0_4_ = fVar152 * local_570;
                  auVar171._4_4_ = fVar152 * fStack_56c;
                  auVar171._8_4_ = fVar152 * fStack_568;
                  auVar171._12_4_ = fVar152 * fStack_564;
                  auVar146._4_4_ = fVar180;
                  auVar146._0_4_ = fVar180;
                  auVar146._8_4_ = fVar180;
                  auVar146._12_4_ = fVar180;
                  auVar69._8_8_ = uStack_558;
                  auVar69._0_8_ = local_560;
                  auVar90 = vfmadd132ps_fma(auVar146,auVar171,auVar69);
                  auVar172._4_4_ = fVar179;
                  auVar172._0_4_ = fVar179;
                  auVar172._8_4_ = fVar179;
                  auVar172._12_4_ = fVar179;
                  auVar67._4_4_ = uStack_64c;
                  auVar67._0_4_ = local_650;
                  auVar67._8_8_ = uStack_648;
                  auVar90 = vfmadd132ps_fma(auVar172,auVar90,auVar67);
                  auVar147._4_4_ = fVar167;
                  auVar147._0_4_ = fVar167;
                  auVar147._8_4_ = fVar167;
                  auVar147._12_4_ = fVar167;
                  auVar90 = vfmadd132ps_fma(auVar147,auVar90,local_610);
                  uVar140 = auVar90._0_4_;
                  local_370._4_4_ = uVar140;
                  local_370._0_4_ = uVar140;
                  local_370._8_4_ = uVar140;
                  local_370._12_4_ = uVar140;
                  local_360 = vshufps_avx(auVar90,auVar90,0x55);
                  local_350 = vshufps_avx(auVar90,auVar90,0xaa);
                  local_320 = local_660._0_8_;
                  uStack_318 = local_660._8_8_;
                  local_310 = local_640;
                  vpcmpeqd_avx2(ZEXT1632(local_640),ZEXT1632(local_640));
                  uStack_2fc = (local_6a0.context)->instID[0];
                  local_300 = uStack_2fc;
                  uStack_2f8 = uStack_2fc;
                  uStack_2f4 = uStack_2fc;
                  uStack_2f0 = (local_6a0.context)->instPrimID[0];
                  uStack_2ec = uStack_2f0;
                  uStack_2e8 = uStack_2f0;
                  uStack_2e4 = uStack_2f0;
                  local_6d0 = local_420._0_8_;
                  uStack_6c8 = local_420._8_8_;
                  local_6a0.valid = (int *)&local_6d0;
                  local_6a0.geometryUserPtr = pGVar78->userPtr;
                  local_6a0.hit = local_370;
                  local_6a0.N = 4;
                  local_3a0 = (undefined4)uVar77;
                  uStack_39c = (undefined4)(uVar77 >> 0x20);
                  local_6a0.ray = (RTCRayN *)ray;
                  uStack_32c = local_330;
                  uStack_328 = local_330;
                  uStack_324 = local_330;
                  if (pGVar78->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar78->occlusionFilterN)(&local_6a0);
                    uVar77 = CONCAT44(uStack_39c,local_3a0);
                    auVar201 = ZEXT1664(_local_670);
                    auVar205 = ZEXT3264(local_480);
                    auVar214 = ZEXT3264(local_4e0);
                    auVar213 = ZEXT3264(local_4c0);
                    auVar212 = ZEXT3264(local_4a0);
                    auVar215 = ZEXT3264(local_5c0);
                    auVar206 = ZEXT3264(local_5a0);
                    auVar209 = ZEXT3264(local_460);
                    auVar208 = ZEXT3264(local_3e0);
                    auVar207 = ZEXT3264(local_440);
                    auVar90 = vxorps_avx512vl(auVar210,auVar210);
                    auVar211 = ZEXT1664(auVar90);
                    fVar168 = local_500;
                  }
                  auVar90 = auVar211._0_16_;
                  auVar63._8_8_ = uStack_6c8;
                  auVar63._0_8_ = local_6d0;
                  uVar83 = vptestmd_avx512vl(auVar63,auVar63);
                  if ((uVar83 & 0xf) != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar78->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_6a0);
                      uVar77 = CONCAT44(uStack_39c,local_3a0);
                      auVar201 = ZEXT1664(_local_670);
                      auVar205 = ZEXT3264(local_480);
                      auVar214 = ZEXT3264(local_4e0);
                      auVar213 = ZEXT3264(local_4c0);
                      auVar212 = ZEXT3264(local_4a0);
                      auVar215 = ZEXT3264(local_5c0);
                      auVar206 = ZEXT3264(local_5a0);
                      auVar209 = ZEXT3264(local_460);
                      auVar208 = ZEXT3264(local_3e0);
                      auVar207 = ZEXT3264(local_440);
                      auVar90 = vxorps_avx512vl(auVar90,auVar90);
                      auVar211 = ZEXT1664(auVar90);
                      fVar168 = local_500;
                    }
                    auVar102 = auVar205._0_32_;
                    auVar64._8_8_ = uStack_6c8;
                    auVar64._0_8_ = local_6d0;
                    auVar90 = *(undefined1 (*) [16])(local_6a0.ray + 0x80);
                    uVar83 = vptestmd_avx512vl(auVar64,auVar64);
                    uVar83 = uVar83 & 0xf;
                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar11 = (bool)((byte)uVar83 & 1);
                    auVar95._0_4_ = (uint)bVar11 * auVar89._0_4_ | (uint)!bVar11 * auVar90._0_4_;
                    bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                    auVar95._4_4_ = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * auVar90._4_4_;
                    bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                    auVar95._8_4_ = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * auVar90._8_4_;
                    bVar11 = SUB81(uVar83 >> 3,0);
                    auVar95._12_4_ = (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * auVar90._12_4_;
                    *(undefined1 (*) [16])(local_6a0.ray + 0x80) = auVar95;
                    fVar152 = auVar201._0_4_;
                    if ((byte)uVar83 != 0) break;
                  }
                  auVar102 = auVar205._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar139;
                  uVar83 = local_3c0 & 0x3f;
                  local_3c0 = 0;
                  uVar77 = uVar77 ^ 1L << uVar83;
                  for (uVar83 = uVar77; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000
                      ) {
                    local_3c0 = local_3c0 + 1;
                  }
                  bVar79 = uVar77 != 0;
                  fVar152 = auVar201._0_4_;
                } while (bVar79);
              }
              goto LAB_01c4b56b;
            }
          }
        }
        bVar79 = false;
      }
LAB_01c4b56b:
      local_500 = fVar152;
      if (8 < iVar7) {
        auVar112 = vpbroadcastd_avx512vl();
        auVar201 = ZEXT3264(auVar112);
        fStack_3b8 = 1.0 / (float)local_630._0_4_;
        local_630 = vpbroadcastd_avx512vl();
        local_620 = vpbroadcastd_avx512vl();
        lVar81 = 8;
        fStack_4fc = local_500;
        fStack_4f8 = local_500;
        fStack_4f4 = local_500;
        fStack_4f0 = local_500;
        fStack_4ec = local_500;
        fStack_4e8 = local_500;
        fStack_4e4 = local_500;
        local_480 = auVar102;
        fStack_3b4 = fStack_3b8;
        fStack_3b0 = fStack_3b8;
        fStack_3ac = fStack_3b8;
        fStack_3a8 = fStack_3b8;
        fStack_3a4 = fStack_3b8;
        local_3a0 = fVar168;
        uStack_39c = fVar168;
        uStack_398 = fVar168;
        uStack_394 = fVar168;
        uStack_390 = fVar168;
        uStack_38c = fVar168;
        uStack_388 = fVar168;
        uStack_384 = fVar168;
        local_3c0._0_4_ = fStack_3b8;
        local_3c0._4_4_ = fStack_3b8;
        do {
          auVar112 = vpbroadcastd_avx512vl();
          auVar97 = vpor_avx2(auVar112,_DAT_0205a920);
          uVar22 = vpcmpgtd_avx512vl(auVar201._0_32_,auVar97);
          auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 * 4 + lVar23);
          auVar114 = *(undefined1 (*) [32])(lVar23 + 0x222bfac + lVar81 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar23 + 0x222c430 + lVar81 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar23 + 0x222c8b4 + lVar81 * 4);
          local_4c0 = auVar213._0_32_;
          auVar98 = vmulps_avx512vl(local_4c0,auVar109);
          local_4e0 = auVar214._0_32_;
          auVar108 = vmulps_avx512vl(local_4e0,auVar109);
          auVar44._4_4_ = auVar109._4_4_ * (float)local_e0._4_4_;
          auVar44._0_4_ = auVar109._0_4_ * (float)local_e0._0_4_;
          auVar44._8_4_ = auVar109._8_4_ * fStack_d8;
          auVar44._12_4_ = auVar109._12_4_ * fStack_d4;
          auVar44._16_4_ = auVar109._16_4_ * fStack_d0;
          auVar44._20_4_ = auVar109._20_4_ * fStack_cc;
          auVar44._24_4_ = auVar109._24_4_ * fStack_c8;
          auVar44._28_4_ = auVar97._28_4_;
          auVar117 = auVar215._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar98,auVar110,auVar117);
          local_4a0 = auVar212._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar108,auVar110,local_4a0);
          auVar108 = vfmadd231ps_avx512vl(auVar44,auVar110,local_c0);
          auVar116 = auVar209._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar114,auVar116);
          auVar113 = auVar206._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar114,auVar113);
          auVar90 = vfmadd231ps_fma(auVar108,auVar114,local_a0);
          auVar115 = auVar207._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar97,auVar112,auVar115);
          local_3e0 = auVar208._0_32_;
          auVar103 = vfmadd231ps_avx512vl(auVar98,auVar112,local_3e0);
          auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 * 4 + lVar23);
          auVar98 = *(undefined1 (*) [32])(lVar23 + 0x222e3cc + lVar81 * 4);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar112,local_80);
          auVar108 = *(undefined1 (*) [32])(lVar23 + 0x222e850 + lVar81 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar23 + 0x222ecd4 + lVar81 * 4);
          auVar102 = vmulps_avx512vl(local_4c0,auVar99);
          auVar100 = vmulps_avx512vl(local_4e0,auVar99);
          auVar45._4_4_ = auVar99._4_4_ * (float)local_e0._4_4_;
          auVar45._0_4_ = auVar99._0_4_ * (float)local_e0._0_4_;
          auVar45._8_4_ = auVar99._8_4_ * fStack_d8;
          auVar45._12_4_ = auVar99._12_4_ * fStack_d4;
          auVar45._16_4_ = auVar99._16_4_ * fStack_d0;
          auVar45._20_4_ = auVar99._20_4_ * fStack_cc;
          auVar45._24_4_ = auVar99._24_4_ * fStack_c8;
          auVar45._28_4_ = uStack_c4;
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar117);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,local_4a0);
          auVar104 = vfmadd231ps_avx512vl(auVar45,auVar108,local_c0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar116);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar113);
          auVar89 = vfmadd231ps_fma(auVar104,auVar98,local_a0);
          auVar104 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar115);
          auVar105 = vfmadd231ps_avx512vl(auVar100,auVar97,local_3e0);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar97,local_80);
          auVar106 = vmaxps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar89));
          auVar102 = vsubps_avx(auVar104,auVar101);
          auVar100 = vsubps_avx(auVar105,auVar103);
          auVar107 = vmulps_avx512vl(auVar103,auVar102);
          auVar111 = vmulps_avx512vl(auVar101,auVar100);
          auVar107 = vsubps_avx512vl(auVar107,auVar111);
          auVar111 = vmulps_avx512vl(auVar100,auVar100);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,auVar102);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          auVar106 = vmulps_avx512vl(auVar106,auVar111);
          auVar107 = vmulps_avx512vl(auVar107,auVar107);
          uVar141 = vcmpps_avx512vl(auVar107,auVar106,2);
          local_230 = (byte)uVar22 & (byte)uVar141;
          if (local_230 == 0) {
            auVar205 = ZEXT3264(auVar113);
            auVar215 = ZEXT3264(auVar117);
          }
          else {
            auVar99 = vmulps_avx512vl(local_480,auVar99);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar99);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar108);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_100,auVar98);
            auVar109 = vmulps_avx512vl(local_480,auVar109);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar109);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_120,auVar110);
            auVar98 = vfmadd213ps_avx512vl(auVar112,local_100,auVar114);
            auVar112 = *(undefined1 (*) [32])(lVar23 + 0x222cd38 + lVar81 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar23 + 0x222d1bc + lVar81 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar23 + 0x222d640 + lVar81 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar23 + 0x222dac4 + lVar81 * 4);
            auVar108 = vmulps_avx512vl(local_4c0,auVar109);
            auVar99 = vmulps_avx512vl(local_4e0,auVar109);
            auVar109 = vmulps_avx512vl(local_480,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar117);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar110,local_4a0);
            auVar110 = vfmadd231ps_avx512vl(auVar109,local_140,auVar110);
            auVar109 = vfmadd231ps_avx512vl(auVar108,auVar114,auVar116);
            auVar108 = vfmadd231ps_avx512vl(auVar99,auVar114,auVar113);
            auVar114 = vfmadd231ps_avx512vl(auVar110,local_120,auVar114);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,auVar115);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_3e0);
            auVar99 = vfmadd231ps_avx512vl(auVar114,local_100,auVar112);
            auVar112 = *(undefined1 (*) [32])(lVar23 + 0x222f158 + lVar81 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar23 + 0x222fa60 + lVar81 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar23 + 0x222fee4 + lVar81 * 4);
            auVar106 = vmulps_avx512vl(local_4c0,auVar110);
            auVar107 = vmulps_avx512vl(local_4e0,auVar110);
            auVar110 = vmulps_avx512vl(local_480,auVar110);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,auVar117);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_4a0);
            auVar110 = vfmadd231ps_avx512vl(auVar110,local_140,auVar114);
            auVar114 = *(undefined1 (*) [32])(lVar23 + 0x222f5dc + lVar81 * 4);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,auVar116);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,auVar113);
            auVar114 = vfmadd231ps_avx512vl(auVar110,local_120,auVar114);
            auVar110 = vfmadd231ps_avx512vl(auVar106,auVar112,auVar115);
            auVar106 = vfmadd231ps_avx512vl(auVar107,auVar112,local_3e0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,local_100,auVar112);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar109,auVar107);
            vandps_avx512vl(auVar108,auVar107);
            auVar112 = vmaxps_avx(auVar107,auVar107);
            vandps_avx512vl(auVar99,auVar107);
            auVar112 = vmaxps_avx(auVar112,auVar107);
            auVar71._4_4_ = fStack_4fc;
            auVar71._0_4_ = local_500;
            auVar71._8_4_ = fStack_4f8;
            auVar71._12_4_ = fStack_4f4;
            auVar71._16_4_ = fStack_4f0;
            auVar71._20_4_ = fStack_4ec;
            auVar71._24_4_ = fStack_4e8;
            auVar71._28_4_ = fStack_4e4;
            uVar83 = vcmpps_avx512vl(auVar112,auVar71,1);
            bVar11 = (bool)((byte)uVar83 & 1);
            auVar123._0_4_ = (float)((uint)bVar11 * auVar102._0_4_ | (uint)!bVar11 * auVar109._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar109._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar109._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar109._12_4_);
            bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * auVar109._16_4_);
            bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * auVar109._20_4_);
            bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar11 * auVar102._24_4_ | (uint)!bVar11 * auVar109._24_4_);
            bVar11 = SUB81(uVar83 >> 7,0);
            auVar123._28_4_ = (uint)bVar11 * auVar102._28_4_ | (uint)!bVar11 * auVar109._28_4_;
            bVar11 = (bool)((byte)uVar83 & 1);
            auVar124._0_4_ = (float)((uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * auVar108._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar108._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar108._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar108._12_4_);
            bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * auVar108._16_4_);
            bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * auVar108._20_4_);
            bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * auVar108._24_4_);
            bVar11 = SUB81(uVar83 >> 7,0);
            auVar124._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar108._28_4_;
            vandps_avx512vl(auVar110,auVar107);
            vandps_avx512vl(auVar106,auVar107);
            auVar112 = vmaxps_avx(auVar124,auVar124);
            vandps_avx512vl(auVar114,auVar107);
            auVar112 = vmaxps_avx(auVar112,auVar124);
            uVar83 = vcmpps_avx512vl(auVar112,auVar71,1);
            bVar11 = (bool)((byte)uVar83 & 1);
            auVar125._0_4_ = (uint)bVar11 * auVar102._0_4_ | (uint)!bVar11 * auVar110._0_4_;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar110._4_4_;
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar110._8_4_;
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar110._12_4_;
            bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar125._16_4_ = (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * auVar110._16_4_;
            bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar125._20_4_ = (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * auVar110._20_4_;
            bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar125._24_4_ = (uint)bVar11 * auVar102._24_4_ | (uint)!bVar11 * auVar110._24_4_;
            bVar11 = SUB81(uVar83 >> 7,0);
            auVar125._28_4_ = (uint)bVar11 * auVar102._28_4_ | (uint)!bVar11 * auVar110._28_4_;
            bVar11 = (bool)((byte)uVar83 & 1);
            auVar126._0_4_ = (float)((uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * auVar106._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar106._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar106._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar106._12_4_);
            bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * auVar106._16_4_);
            bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * auVar106._20_4_);
            bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * auVar106._24_4_);
            bVar11 = SUB81(uVar83 >> 7,0);
            auVar126._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar106._28_4_;
            auVar195._8_4_ = 0x80000000;
            auVar195._0_8_ = 0x8000000080000000;
            auVar195._12_4_ = 0x80000000;
            auVar195._16_4_ = 0x80000000;
            auVar195._20_4_ = 0x80000000;
            auVar195._24_4_ = 0x80000000;
            auVar195._28_4_ = 0x80000000;
            auVar112 = vxorps_avx512vl(auVar125,auVar195);
            auVar106 = auVar211._0_32_;
            auVar114 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar106);
            auVar91 = vfmadd231ps_fma(auVar114,auVar124,auVar124);
            auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
            auVar204._8_4_ = 0xbf000000;
            auVar204._0_8_ = 0xbf000000bf000000;
            auVar204._12_4_ = 0xbf000000;
            auVar204._16_4_ = 0xbf000000;
            auVar204._20_4_ = 0xbf000000;
            auVar204._24_4_ = 0xbf000000;
            auVar204._28_4_ = 0xbf000000;
            fVar168 = auVar114._0_4_;
            fVar152 = auVar114._4_4_;
            fVar167 = auVar114._8_4_;
            fVar179 = auVar114._12_4_;
            fVar180 = auVar114._16_4_;
            fVar181 = auVar114._20_4_;
            fVar162 = auVar114._24_4_;
            auVar46._4_4_ = fVar152 * fVar152 * fVar152 * auVar91._4_4_ * -0.5;
            auVar46._0_4_ = fVar168 * fVar168 * fVar168 * auVar91._0_4_ * -0.5;
            auVar46._8_4_ = fVar167 * fVar167 * fVar167 * auVar91._8_4_ * -0.5;
            auVar46._12_4_ = fVar179 * fVar179 * fVar179 * auVar91._12_4_ * -0.5;
            auVar46._16_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar46._20_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar46._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
            auVar46._28_4_ = auVar124._28_4_;
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar114 = vfmadd231ps_avx512vl(auVar46,auVar110,auVar114);
            auVar47._4_4_ = auVar124._4_4_ * auVar114._4_4_;
            auVar47._0_4_ = auVar124._0_4_ * auVar114._0_4_;
            auVar47._8_4_ = auVar124._8_4_ * auVar114._8_4_;
            auVar47._12_4_ = auVar124._12_4_ * auVar114._12_4_;
            auVar47._16_4_ = auVar124._16_4_ * auVar114._16_4_;
            auVar47._20_4_ = auVar124._20_4_ * auVar114._20_4_;
            auVar47._24_4_ = auVar124._24_4_ * auVar114._24_4_;
            auVar47._28_4_ = 0;
            auVar48._4_4_ = auVar114._4_4_ * -auVar123._4_4_;
            auVar48._0_4_ = auVar114._0_4_ * -auVar123._0_4_;
            auVar48._8_4_ = auVar114._8_4_ * -auVar123._8_4_;
            auVar48._12_4_ = auVar114._12_4_ * -auVar123._12_4_;
            auVar48._16_4_ = auVar114._16_4_ * -auVar123._16_4_;
            auVar48._20_4_ = auVar114._20_4_ * -auVar123._20_4_;
            auVar48._24_4_ = auVar114._24_4_ * -auVar123._24_4_;
            auVar48._28_4_ = auVar124._28_4_;
            auVar109 = vmulps_avx512vl(auVar114,auVar106);
            auVar114 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar106);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar126,auVar126);
            auVar108 = vrsqrt14ps_avx512vl(auVar114);
            auVar114 = vmulps_avx512vl(auVar114,auVar204);
            fVar168 = auVar108._0_4_;
            fVar152 = auVar108._4_4_;
            fVar167 = auVar108._8_4_;
            fVar179 = auVar108._12_4_;
            fVar180 = auVar108._16_4_;
            fVar181 = auVar108._20_4_;
            fVar162 = auVar108._24_4_;
            auVar49._4_4_ = fVar152 * fVar152 * fVar152 * auVar114._4_4_;
            auVar49._0_4_ = fVar168 * fVar168 * fVar168 * auVar114._0_4_;
            auVar49._8_4_ = fVar167 * fVar167 * fVar167 * auVar114._8_4_;
            auVar49._12_4_ = fVar179 * fVar179 * fVar179 * auVar114._12_4_;
            auVar49._16_4_ = fVar180 * fVar180 * fVar180 * auVar114._16_4_;
            auVar49._20_4_ = fVar181 * fVar181 * fVar181 * auVar114._20_4_;
            auVar49._24_4_ = fVar162 * fVar162 * fVar162 * auVar114._24_4_;
            auVar49._28_4_ = auVar114._28_4_;
            auVar114 = vfmadd231ps_avx512vl(auVar49,auVar110,auVar108);
            auVar50._4_4_ = auVar126._4_4_ * auVar114._4_4_;
            auVar50._0_4_ = auVar126._0_4_ * auVar114._0_4_;
            auVar50._8_4_ = auVar126._8_4_ * auVar114._8_4_;
            auVar50._12_4_ = auVar126._12_4_ * auVar114._12_4_;
            auVar50._16_4_ = auVar126._16_4_ * auVar114._16_4_;
            auVar50._20_4_ = auVar126._20_4_ * auVar114._20_4_;
            auVar50._24_4_ = auVar126._24_4_ * auVar114._24_4_;
            auVar50._28_4_ = auVar108._28_4_;
            auVar51._4_4_ = auVar114._4_4_ * auVar112._4_4_;
            auVar51._0_4_ = auVar114._0_4_ * auVar112._0_4_;
            auVar51._8_4_ = auVar114._8_4_ * auVar112._8_4_;
            auVar51._12_4_ = auVar114._12_4_ * auVar112._12_4_;
            auVar51._16_4_ = auVar114._16_4_ * auVar112._16_4_;
            auVar51._20_4_ = auVar114._20_4_ * auVar112._20_4_;
            auVar51._24_4_ = auVar114._24_4_ * auVar112._24_4_;
            auVar51._28_4_ = auVar112._28_4_;
            auVar112 = vmulps_avx512vl(auVar114,auVar106);
            auVar91 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar90),auVar101);
            auVar114 = ZEXT1632(auVar90);
            auVar210 = vfmadd213ps_fma(auVar48,auVar114,auVar103);
            auVar110 = vfmadd213ps_avx512vl(auVar109,auVar114,auVar98);
            auVar108 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar89),auVar104);
            auVar21 = vfnmadd213ps_fma(auVar47,auVar114,auVar101);
            auVar99 = ZEXT1632(auVar89);
            auVar17 = vfmadd213ps_fma(auVar51,auVar99,auVar105);
            auVar92 = vfnmadd213ps_fma(auVar48,auVar114,auVar103);
            auVar18 = vfmadd213ps_fma(auVar112,auVar99,auVar97);
            auVar103 = ZEXT1632(auVar90);
            auVar94 = vfnmadd231ps_fma(auVar98,auVar103,auVar109);
            auVar93 = vfnmadd213ps_fma(auVar50,auVar99,auVar104);
            auVar25 = vfnmadd213ps_fma(auVar51,auVar99,auVar105);
            auVar26 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar89),auVar112);
            auVar97 = vsubps_avx512vl(auVar108,ZEXT1632(auVar21));
            auVar112 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar92));
            auVar114 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar94));
            auVar52._4_4_ = auVar112._4_4_ * auVar94._4_4_;
            auVar52._0_4_ = auVar112._0_4_ * auVar94._0_4_;
            auVar52._8_4_ = auVar112._8_4_ * auVar94._8_4_;
            auVar52._12_4_ = auVar112._12_4_ * auVar94._12_4_;
            auVar52._16_4_ = auVar112._16_4_ * 0.0;
            auVar52._20_4_ = auVar112._20_4_ * 0.0;
            auVar52._24_4_ = auVar112._24_4_ * 0.0;
            auVar52._28_4_ = auVar109._28_4_;
            auVar90 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar92),auVar114);
            auVar53._4_4_ = auVar114._4_4_ * auVar21._4_4_;
            auVar53._0_4_ = auVar114._0_4_ * auVar21._0_4_;
            auVar53._8_4_ = auVar114._8_4_ * auVar21._8_4_;
            auVar53._12_4_ = auVar114._12_4_ * auVar21._12_4_;
            auVar53._16_4_ = auVar114._16_4_ * 0.0;
            auVar53._20_4_ = auVar114._20_4_ * 0.0;
            auVar53._24_4_ = auVar114._24_4_ * 0.0;
            auVar53._28_4_ = auVar114._28_4_;
            auVar19 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar94),auVar97);
            auVar54._4_4_ = auVar92._4_4_ * auVar97._4_4_;
            auVar54._0_4_ = auVar92._0_4_ * auVar97._0_4_;
            auVar54._8_4_ = auVar92._8_4_ * auVar97._8_4_;
            auVar54._12_4_ = auVar92._12_4_ * auVar97._12_4_;
            auVar54._16_4_ = auVar97._16_4_ * 0.0;
            auVar54._20_4_ = auVar97._20_4_ * 0.0;
            auVar54._24_4_ = auVar97._24_4_ * 0.0;
            auVar54._28_4_ = auVar97._28_4_;
            auVar20 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar21),auVar112);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar106,ZEXT1632(auVar19));
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar90));
            uVar83 = vcmpps_avx512vl(auVar112,auVar106,2);
            bVar74 = (byte)uVar83;
            fVar85 = (float)((uint)(bVar74 & 1) * auVar91._0_4_ |
                            (uint)!(bool)(bVar74 & 1) * auVar93._0_4_);
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar133 = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar93._4_4_);
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar135 = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar93._8_4_);
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar137 = (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar93._12_4_);
            auVar99 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar85))));
            fVar132 = (float)((uint)(bVar74 & 1) * auVar210._0_4_ |
                             (uint)!(bool)(bVar74 & 1) * auVar25._0_4_);
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar134 = (float)((uint)bVar11 * auVar210._4_4_ | (uint)!bVar11 * auVar25._4_4_);
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar136 = (float)((uint)bVar11 * auVar210._8_4_ | (uint)!bVar11 * auVar25._8_4_);
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar138 = (float)((uint)bVar11 * auVar210._12_4_ | (uint)!bVar11 * auVar25._12_4_);
            auVar102 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
            auVar127._0_4_ =
                 (float)((uint)(bVar74 & 1) * auVar110._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar26._0_4_);
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar11 * auVar110._4_4_ | (uint)!bVar11 * auVar26._4_4_);
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar11 * auVar110._8_4_ | (uint)!bVar11 * auVar26._8_4_);
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar11 * auVar110._12_4_ | (uint)!bVar11 * auVar26._12_4_);
            fVar152 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar110._16_4_);
            auVar127._16_4_ = fVar152;
            fVar168 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar110._20_4_);
            auVar127._20_4_ = fVar168;
            fVar167 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar110._24_4_);
            auVar127._24_4_ = fVar167;
            iVar1 = (uint)(byte)(uVar83 >> 7) * auVar110._28_4_;
            auVar127._28_4_ = iVar1;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar21),auVar108);
            auVar128._0_4_ =
                 (uint)(bVar74 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar90._0_4_;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar11 * auVar112._4_4_ | (uint)!bVar11 * auVar90._4_4_;
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar11 * auVar112._8_4_ | (uint)!bVar11 * auVar90._8_4_;
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar11 * auVar112._12_4_ | (uint)!bVar11 * auVar90._12_4_;
            auVar128._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_;
            auVar128._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_;
            auVar128._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_;
            auVar128._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar17));
            auVar129._0_4_ =
                 (float)((uint)(bVar74 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar91._0_4_);
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar11 * auVar112._4_4_ | (uint)!bVar11 * auVar91._4_4_);
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar11 * auVar112._8_4_ | (uint)!bVar11 * auVar91._8_4_);
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar11 * auVar112._12_4_ | (uint)!bVar11 * auVar91._12_4_);
            fVar180 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_);
            auVar129._16_4_ = fVar180;
            fVar179 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_);
            auVar129._20_4_ = fVar179;
            fVar181 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_);
            auVar129._24_4_ = fVar181;
            auVar129._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar18));
            auVar130._0_4_ =
                 (float)((uint)(bVar74 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar210._0_4_);
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar11 * auVar112._4_4_ | (uint)!bVar11 * auVar210._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar11 * auVar112._8_4_ | (uint)!bVar11 * auVar210._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar11 * auVar112._12_4_ | (uint)!bVar11 * auVar210._12_4_);
            fVar166 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_);
            auVar130._16_4_ = fVar166;
            fVar162 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_);
            auVar130._20_4_ = fVar162;
            fVar84 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_);
            auVar130._24_4_ = fVar84;
            iVar2 = (uint)(byte)(uVar83 >> 7) * auVar112._28_4_;
            auVar130._28_4_ = iVar2;
            auVar131._0_4_ =
                 (uint)(bVar74 & 1) * (int)auVar21._0_4_ |
                 (uint)!(bool)(bVar74 & 1) * auVar108._0_4_;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar11 * (int)auVar21._4_4_ | (uint)!bVar11 * auVar108._4_4_;
            bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar11 * (int)auVar21._8_4_ | (uint)!bVar11 * auVar108._8_4_;
            bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar11 * (int)auVar21._12_4_ | (uint)!bVar11 * auVar108._12_4_;
            auVar131._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar108._16_4_;
            auVar131._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar108._20_4_;
            auVar131._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar108._24_4_;
            auVar131._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar108._28_4_;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar108 = vsubps_avx512vl(auVar131,auVar99);
            auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar92._12_4_ |
                                                     (uint)!bVar15 * auVar17._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar92._8_4_ |
                                                              (uint)!bVar14 * auVar17._8_4_,
                                                              CONCAT44((uint)bVar11 *
                                                                       (int)auVar92._4_4_ |
                                                                       (uint)!bVar11 * auVar17._4_4_
                                                                       ,(uint)(bVar74 & 1) *
                                                                        (int)auVar92._0_4_ |
                                                                        (uint)!(bool)(bVar74 & 1) *
                                                                        auVar17._0_4_)))),auVar102);
            auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar94._12_4_ |
                                                     (uint)!bVar16 * auVar18._12_4_,
                                                     CONCAT48((uint)bVar13 * (int)auVar94._8_4_ |
                                                              (uint)!bVar13 * auVar18._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar94._4_4_ |
                                                                       (uint)!bVar12 * auVar18._4_4_
                                                                       ,(uint)(bVar74 & 1) *
                                                                        (int)auVar94._0_4_ |
                                                                        (uint)!(bool)(bVar74 & 1) *
                                                                        auVar18._0_4_)))),auVar127);
            auVar109 = vsubps_avx(auVar99,auVar128);
            auVar97 = vsubps_avx(auVar102,auVar129);
            auVar98 = vsubps_avx(auVar127,auVar130);
            auVar55._4_4_ = auVar110._4_4_ * fVar133;
            auVar55._0_4_ = auVar110._0_4_ * fVar85;
            auVar55._8_4_ = auVar110._8_4_ * fVar135;
            auVar55._12_4_ = auVar110._12_4_ * fVar137;
            auVar55._16_4_ = auVar110._16_4_ * 0.0;
            auVar55._20_4_ = auVar110._20_4_ * 0.0;
            auVar55._24_4_ = auVar110._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar55,auVar127,auVar108);
            auVar165._0_4_ = fVar132 * auVar108._0_4_;
            auVar165._4_4_ = fVar134 * auVar108._4_4_;
            auVar165._8_4_ = fVar136 * auVar108._8_4_;
            auVar165._12_4_ = fVar138 * auVar108._12_4_;
            auVar165._16_4_ = auVar108._16_4_ * 0.0;
            auVar165._20_4_ = auVar108._20_4_ * 0.0;
            auVar165._24_4_ = auVar108._24_4_ * 0.0;
            auVar165._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar165,auVar99,auVar114);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar106,ZEXT1632(auVar90));
            auVar177._0_4_ = auVar114._0_4_ * auVar127._0_4_;
            auVar177._4_4_ = auVar114._4_4_ * auVar127._4_4_;
            auVar177._8_4_ = auVar114._8_4_ * auVar127._8_4_;
            auVar177._12_4_ = auVar114._12_4_ * auVar127._12_4_;
            auVar177._16_4_ = auVar114._16_4_ * fVar152;
            auVar177._20_4_ = auVar114._20_4_ * fVar168;
            auVar177._24_4_ = auVar114._24_4_ * fVar167;
            auVar177._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar177,auVar102,auVar110);
            auVar100 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar90));
            auVar112 = vmulps_avx512vl(auVar98,auVar128);
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar109,auVar130);
            auVar56._4_4_ = auVar97._4_4_ * auVar130._4_4_;
            auVar56._0_4_ = auVar97._0_4_ * auVar130._0_4_;
            auVar56._8_4_ = auVar97._8_4_ * auVar130._8_4_;
            auVar56._12_4_ = auVar97._12_4_ * auVar130._12_4_;
            auVar56._16_4_ = auVar97._16_4_ * fVar166;
            auVar56._20_4_ = auVar97._20_4_ * fVar162;
            auVar56._24_4_ = auVar97._24_4_ * fVar84;
            auVar56._28_4_ = iVar2;
            auVar90 = vfmsub231ps_fma(auVar56,auVar129,auVar98);
            auVar178._0_4_ = auVar129._0_4_ * auVar109._0_4_;
            auVar178._4_4_ = auVar129._4_4_ * auVar109._4_4_;
            auVar178._8_4_ = auVar129._8_4_ * auVar109._8_4_;
            auVar178._12_4_ = auVar129._12_4_ * auVar109._12_4_;
            auVar178._16_4_ = fVar180 * auVar109._16_4_;
            auVar178._20_4_ = fVar179 * auVar109._20_4_;
            auVar178._24_4_ = fVar181 * auVar109._24_4_;
            auVar178._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar178,auVar97,auVar128);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar106,auVar112);
            auVar101 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar90));
            auVar112 = vmaxps_avx(auVar100,auVar101);
            uVar141 = vcmpps_avx512vl(auVar112,auVar106,2);
            local_230 = local_230 & (byte)uVar141;
            if (local_230 == 0) {
LAB_01c4c158:
              local_230 = 0;
            }
            else {
              auVar57._4_4_ = auVar98._4_4_ * auVar114._4_4_;
              auVar57._0_4_ = auVar98._0_4_ * auVar114._0_4_;
              auVar57._8_4_ = auVar98._8_4_ * auVar114._8_4_;
              auVar57._12_4_ = auVar98._12_4_ * auVar114._12_4_;
              auVar57._16_4_ = auVar98._16_4_ * auVar114._16_4_;
              auVar57._20_4_ = auVar98._20_4_ * auVar114._20_4_;
              auVar57._24_4_ = auVar98._24_4_ * auVar114._24_4_;
              auVar57._28_4_ = auVar112._28_4_;
              auVar210 = vfmsub231ps_fma(auVar57,auVar97,auVar110);
              auVar58._4_4_ = auVar110._4_4_ * auVar109._4_4_;
              auVar58._0_4_ = auVar110._0_4_ * auVar109._0_4_;
              auVar58._8_4_ = auVar110._8_4_ * auVar109._8_4_;
              auVar58._12_4_ = auVar110._12_4_ * auVar109._12_4_;
              auVar58._16_4_ = auVar110._16_4_ * auVar109._16_4_;
              auVar58._20_4_ = auVar110._20_4_ * auVar109._20_4_;
              auVar58._24_4_ = auVar110._24_4_ * auVar109._24_4_;
              auVar58._28_4_ = auVar110._28_4_;
              auVar91 = vfmsub231ps_fma(auVar58,auVar108,auVar98);
              auVar59._4_4_ = auVar97._4_4_ * auVar108._4_4_;
              auVar59._0_4_ = auVar97._0_4_ * auVar108._0_4_;
              auVar59._8_4_ = auVar97._8_4_ * auVar108._8_4_;
              auVar59._12_4_ = auVar97._12_4_ * auVar108._12_4_;
              auVar59._16_4_ = auVar97._16_4_ * auVar108._16_4_;
              auVar59._20_4_ = auVar97._20_4_ * auVar108._20_4_;
              auVar59._24_4_ = auVar97._24_4_ * auVar108._24_4_;
              auVar59._28_4_ = auVar97._28_4_;
              auVar17 = vfmsub231ps_fma(auVar59,auVar109,auVar114);
              auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar17));
              auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar210),auVar106);
              auVar114 = vrcp14ps_avx512vl(auVar112);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = &DAT_3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              auVar34._16_4_ = 0x3f800000;
              auVar34._20_4_ = 0x3f800000;
              auVar34._24_4_ = 0x3f800000;
              auVar34._28_4_ = 0x3f800000;
              auVar110 = vfnmadd213ps_avx512vl(auVar114,auVar112,auVar34);
              auVar90 = vfmadd132ps_fma(auVar110,auVar114,auVar114);
              auVar60._4_4_ = auVar17._4_4_ * auVar127._4_4_;
              auVar60._0_4_ = auVar17._0_4_ * auVar127._0_4_;
              auVar60._8_4_ = auVar17._8_4_ * auVar127._8_4_;
              auVar60._12_4_ = auVar17._12_4_ * auVar127._12_4_;
              auVar60._16_4_ = fVar152 * 0.0;
              auVar60._20_4_ = fVar168 * 0.0;
              auVar60._24_4_ = fVar167 * 0.0;
              auVar60._28_4_ = iVar1;
              auVar91 = vfmadd231ps_fma(auVar60,auVar102,ZEXT1632(auVar91));
              auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar99,ZEXT1632(auVar210));
              fVar168 = auVar90._0_4_;
              fVar152 = auVar90._4_4_;
              fVar167 = auVar90._8_4_;
              fVar179 = auVar90._12_4_;
              auVar114 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar179,
                                            CONCAT48(auVar91._8_4_ * fVar167,
                                                     CONCAT44(auVar91._4_4_ * fVar152,
                                                              auVar91._0_4_ * fVar168))));
              auVar72._4_4_ = uStack_39c;
              auVar72._0_4_ = local_3a0;
              auVar72._8_4_ = uStack_398;
              auVar72._12_4_ = uStack_394;
              auVar72._16_4_ = uStack_390;
              auVar72._20_4_ = uStack_38c;
              auVar72._24_4_ = uStack_388;
              auVar72._28_4_ = uStack_384;
              uVar141 = vcmpps_avx512vl(auVar114,auVar72,0xd);
              uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar35._4_4_ = uVar139;
              auVar35._0_4_ = uVar139;
              auVar35._8_4_ = uVar139;
              auVar35._12_4_ = uVar139;
              auVar35._16_4_ = uVar139;
              auVar35._20_4_ = uVar139;
              auVar35._24_4_ = uVar139;
              auVar35._28_4_ = uVar139;
              uVar22 = vcmpps_avx512vl(auVar114,auVar35,2);
              local_230 = (byte)uVar141 & (byte)uVar22 & local_230;
              if (local_230 == 0) goto LAB_01c4c158;
              uVar141 = vcmpps_avx512vl(auVar112,auVar106,4);
              if ((local_230 & (byte)uVar141) == 0) {
                local_230 = 0;
              }
              else {
                local_230 = local_230 & (byte)uVar141;
                fVar180 = auVar100._0_4_ * fVar168;
                fVar181 = auVar100._4_4_ * fVar152;
                auVar61._4_4_ = fVar181;
                auVar61._0_4_ = fVar180;
                fVar162 = auVar100._8_4_ * fVar167;
                auVar61._8_4_ = fVar162;
                fVar166 = auVar100._12_4_ * fVar179;
                auVar61._12_4_ = fVar166;
                fVar84 = auVar100._16_4_ * 0.0;
                auVar61._16_4_ = fVar84;
                fVar85 = auVar100._20_4_ * 0.0;
                auVar61._20_4_ = fVar85;
                fVar132 = auVar100._24_4_ * 0.0;
                auVar61._24_4_ = fVar132;
                auVar61._28_4_ = auVar100._28_4_;
                fVar168 = auVar101._0_4_ * fVar168;
                fVar152 = auVar101._4_4_ * fVar152;
                auVar62._4_4_ = fVar152;
                auVar62._0_4_ = fVar168;
                fVar167 = auVar101._8_4_ * fVar167;
                auVar62._8_4_ = fVar167;
                fVar179 = auVar101._12_4_ * fVar179;
                auVar62._12_4_ = fVar179;
                fVar133 = auVar101._16_4_ * 0.0;
                auVar62._16_4_ = fVar133;
                fVar134 = auVar101._20_4_ * 0.0;
                auVar62._20_4_ = fVar134;
                fVar135 = auVar101._24_4_ * 0.0;
                auVar62._24_4_ = fVar135;
                auVar62._28_4_ = auVar101._28_4_;
                auVar186._8_4_ = 0x3f800000;
                auVar186._0_8_ = &DAT_3f8000003f800000;
                auVar186._12_4_ = 0x3f800000;
                auVar186._16_4_ = 0x3f800000;
                auVar186._20_4_ = 0x3f800000;
                auVar186._24_4_ = 0x3f800000;
                auVar186._28_4_ = 0x3f800000;
                auVar112 = vsubps_avx(auVar186,auVar61);
                local_520._0_4_ =
                     (uint)(bVar74 & 1) * (int)fVar180 | (uint)!(bool)(bVar74 & 1) * auVar112._0_4_;
                bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                local_520._4_4_ = (uint)bVar11 * (int)fVar181 | (uint)!bVar11 * auVar112._4_4_;
                bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                local_520._8_4_ = (uint)bVar11 * (int)fVar162 | (uint)!bVar11 * auVar112._8_4_;
                bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
                local_520._12_4_ = (uint)bVar11 * (int)fVar166 | (uint)!bVar11 * auVar112._12_4_;
                bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
                local_520._16_4_ = (uint)bVar11 * (int)fVar84 | (uint)!bVar11 * auVar112._16_4_;
                bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
                local_520._20_4_ = (uint)bVar11 * (int)fVar85 | (uint)!bVar11 * auVar112._20_4_;
                bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
                local_520._24_4_ = (uint)bVar11 * (int)fVar132 | (uint)!bVar11 * auVar112._24_4_;
                bVar11 = SUB81(uVar83 >> 7,0);
                local_520._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar112._28_4_;
                auVar112 = vsubps_avx(auVar186,auVar62);
                local_1c0._0_4_ =
                     (uint)(bVar74 & 1) * (int)fVar168 | (uint)!(bool)(bVar74 & 1) * auVar112._0_4_;
                bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                local_1c0._4_4_ = (uint)bVar11 * (int)fVar152 | (uint)!bVar11 * auVar112._4_4_;
                bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                local_1c0._8_4_ = (uint)bVar11 * (int)fVar167 | (uint)!bVar11 * auVar112._8_4_;
                bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
                local_1c0._12_4_ = (uint)bVar11 * (int)fVar179 | (uint)!bVar11 * auVar112._12_4_;
                bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
                local_1c0._16_4_ = (uint)bVar11 * (int)fVar133 | (uint)!bVar11 * auVar112._16_4_;
                bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
                local_1c0._20_4_ = (uint)bVar11 * (int)fVar134 | (uint)!bVar11 * auVar112._20_4_;
                bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
                local_1c0._24_4_ = (uint)bVar11 * (int)fVar135 | (uint)!bVar11 * auVar112._24_4_;
                bVar11 = SUB81(uVar83 >> 7,0);
                local_1c0._28_4_ = (uint)bVar11 * auVar101._28_4_ | (uint)!bVar11 * auVar112._28_4_;
                local_540 = auVar114;
              }
            }
            auVar215 = ZEXT3264(local_5c0);
            auVar205 = ZEXT3264(local_5a0);
            if (local_230 != 0) {
              auVar112 = vsubps_avx(ZEXT1632(auVar89),auVar103);
              auVar90 = vfmadd213ps_fma(auVar112,local_520,auVar103);
              uVar139 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
              auVar36._4_4_ = uVar139;
              auVar36._0_4_ = uVar139;
              auVar36._8_4_ = uVar139;
              auVar36._12_4_ = uVar139;
              auVar36._16_4_ = uVar139;
              auVar36._20_4_ = uVar139;
              auVar36._24_4_ = uVar139;
              auVar36._28_4_ = uVar139;
              auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                            CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                     CONCAT44(auVar90._4_4_ +
                                                                              auVar90._4_4_,
                                                                              auVar90._0_4_ +
                                                                              auVar90._0_4_)))),
                                         auVar36);
              uVar141 = vcmpps_avx512vl(local_540,auVar112,6);
              local_230 = local_230 & (byte)uVar141;
              if (local_230 != 0) {
                auVar151._8_4_ = 0xbf800000;
                auVar151._0_8_ = 0xbf800000bf800000;
                auVar151._12_4_ = 0xbf800000;
                auVar151._16_4_ = 0xbf800000;
                auVar151._20_4_ = 0xbf800000;
                auVar151._24_4_ = 0xbf800000;
                auVar151._28_4_ = 0xbf800000;
                auVar37._8_4_ = 0x40000000;
                auVar37._0_8_ = 0x4000000040000000;
                auVar37._12_4_ = 0x40000000;
                auVar37._16_4_ = 0x40000000;
                auVar37._20_4_ = 0x40000000;
                auVar37._24_4_ = 0x40000000;
                auVar37._28_4_ = 0x40000000;
                local_2c0 = vfmadd132ps_avx512vl(local_1c0,auVar151,auVar37);
                local_1c0 = local_2c0;
                auVar112 = local_1c0;
                local_280 = (undefined4)lVar81;
                local_270 = local_610._0_8_;
                uStack_268 = local_610._8_8_;
                local_260 = local_3f0._0_8_;
                uStack_258 = local_3f0._8_8_;
                local_250 = local_400._0_8_;
                uStack_248 = local_400._8_8_;
                local_240 = local_410._0_8_;
                uStack_238 = local_410._8_8_;
                pGVar78 = (context->scene->geometries).items[local_6b8].ptr;
                if ((pGVar78->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar74 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar74 = 1, pGVar78->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_160 = vmovdqa64_avx512vl(auVar201._0_32_);
                  auVar90 = vcvtsi2ss_avx512f(auVar206._0_16_,local_280);
                  fVar168 = auVar90._0_4_;
                  local_220[0] = (fVar168 + local_520._0_4_ + 0.0) * (float)local_3c0;
                  local_220[1] = (fVar168 + local_520._4_4_ + 1.0) * local_3c0._4_4_;
                  local_220[2] = (fVar168 + local_520._8_4_ + 2.0) * fStack_3b8;
                  local_220[3] = (fVar168 + local_520._12_4_ + 3.0) * fStack_3b4;
                  fStack_210 = (fVar168 + local_520._16_4_ + 4.0) * fStack_3b0;
                  fStack_20c = (fVar168 + local_520._20_4_ + 5.0) * fStack_3ac;
                  fStack_208 = (fVar168 + local_520._24_4_ + 6.0) * fStack_3a8;
                  fStack_204 = fVar168 + local_520._28_4_ + 7.0;
                  local_1c0._0_8_ = local_2c0._0_8_;
                  local_1c0._8_8_ = local_2c0._8_8_;
                  local_1c0._16_8_ = local_2c0._16_8_;
                  local_1c0._24_8_ = local_2c0._24_8_;
                  local_200 = local_1c0._0_8_;
                  uStack_1f8 = local_1c0._8_8_;
                  uStack_1f0 = local_1c0._16_8_;
                  uStack_1e8 = local_1c0._24_8_;
                  local_1e0 = local_540;
                  local_560 = local_3f0._0_8_;
                  uStack_558 = local_3f0._8_8_;
                  uVar83 = 0;
                  uVar75 = (ulong)local_230;
                  for (uVar77 = uVar75; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000
                      ) {
                    uVar83 = uVar83 + 1;
                  }
                  local_570 = local_400._0_4_;
                  fStack_56c = local_400._4_4_;
                  fStack_568 = local_400._8_4_;
                  fStack_564 = local_400._12_4_;
                  _local_670 = local_410;
                  local_660._0_4_ = 1;
                  local_6b0 = pGVar78;
                  local_2e0 = local_520;
                  local_2a0 = local_540;
                  local_27c = iVar7;
                  local_1c0 = auVar112;
                  do {
                    local_650 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar168 = local_220[uVar83];
                    local_340._4_4_ = fVar168;
                    local_340._0_4_ = fVar168;
                    local_340._8_4_ = fVar168;
                    local_340._12_4_ = fVar168;
                    local_330 = *(undefined4 *)((long)&local_200 + uVar83 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar83 * 4);
                    local_6a0.context = context->user;
                    fVar152 = 1.0 - fVar168;
                    auVar30._8_4_ = 0x80000000;
                    auVar30._0_8_ = 0x8000000080000000;
                    auVar30._12_4_ = 0x80000000;
                    auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar152),auVar30);
                    auVar90 = ZEXT416((uint)(fVar168 * fVar152 * 4.0));
                    auVar89 = vfnmsub213ss_fma(local_340,local_340,auVar90);
                    auVar90 = vfmadd213ss_fma(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),auVar90)
                    ;
                    fVar152 = fVar152 * auVar91._0_4_ * 0.5;
                    fVar167 = auVar89._0_4_ * 0.5;
                    fVar179 = auVar90._0_4_ * 0.5;
                    fVar168 = fVar168 * fVar168 * 0.5;
                    auVar173._0_4_ = fVar168 * (float)local_670._0_4_;
                    auVar173._4_4_ = fVar168 * (float)local_670._4_4_;
                    auVar173._8_4_ = fVar168 * fStack_668;
                    auVar173._12_4_ = fVar168 * fStack_664;
                    auVar148._4_4_ = fVar179;
                    auVar148._0_4_ = fVar179;
                    auVar148._8_4_ = fVar179;
                    auVar148._12_4_ = fVar179;
                    auVar68._4_4_ = fStack_56c;
                    auVar68._0_4_ = local_570;
                    auVar68._8_4_ = fStack_568;
                    auVar68._12_4_ = fStack_564;
                    auVar90 = vfmadd132ps_fma(auVar148,auVar173,auVar68);
                    auVar174._4_4_ = fVar167;
                    auVar174._0_4_ = fVar167;
                    auVar174._8_4_ = fVar167;
                    auVar174._12_4_ = fVar167;
                    auVar70._8_8_ = uStack_558;
                    auVar70._0_8_ = local_560;
                    auVar90 = vfmadd132ps_fma(auVar174,auVar90,auVar70);
                    auVar149._4_4_ = fVar152;
                    auVar149._0_4_ = fVar152;
                    auVar149._8_4_ = fVar152;
                    auVar149._12_4_ = fVar152;
                    auVar90 = vfmadd132ps_fma(auVar149,auVar90,local_610);
                    uVar139 = auVar90._0_4_;
                    local_370._4_4_ = uVar139;
                    local_370._0_4_ = uVar139;
                    local_370._8_4_ = uVar139;
                    local_370._12_4_ = uVar139;
                    local_360 = vshufps_avx(auVar90,auVar90,0x55);
                    local_350 = vshufps_avx(auVar90,auVar90,0xaa);
                    local_320 = local_620._0_8_;
                    uStack_318 = local_620._8_8_;
                    local_310 = local_630;
                    vpcmpeqd_avx2(ZEXT1632(local_630),ZEXT1632(local_630));
                    uStack_2fc = (local_6a0.context)->instID[0];
                    local_300 = uStack_2fc;
                    uStack_2f8 = uStack_2fc;
                    uStack_2f4 = uStack_2fc;
                    uStack_2f0 = (local_6a0.context)->instPrimID[0];
                    uStack_2ec = uStack_2f0;
                    uStack_2e8 = uStack_2f0;
                    uStack_2e4 = uStack_2f0;
                    local_6d0 = local_420._0_8_;
                    uStack_6c8 = local_420._8_8_;
                    local_6a0.valid = (int *)&local_6d0;
                    local_6a0.geometryUserPtr = pGVar78->userPtr;
                    local_6a0.hit = local_370;
                    local_6a0.N = 4;
                    pRVar73 = (RayK<4> *)pGVar78->occlusionFilterN;
                    local_640._0_8_ = uVar83;
                    uVar77 = uVar83;
                    local_6a0.ray = (RTCRayN *)ray;
                    uStack_32c = local_330;
                    uStack_328 = local_330;
                    uStack_324 = local_330;
                    if (pRVar73 != (RayK<4> *)0x0) {
                      pRVar73 = (RayK<4> *)(*(code *)pRVar73)(&local_6a0);
                      uVar77 = local_640._0_8_;
                      pGVar78 = local_6b0;
                    }
                    auVar65._8_8_ = uStack_6c8;
                    auVar65._0_8_ = local_6d0;
                    uVar83 = vptestmd_avx512vl(auVar65,auVar65);
                    if ((uVar83 & 0xf) != 0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar78->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&local_6a0);
                        uVar77 = local_640._0_8_;
                        pGVar78 = local_6b0;
                      }
                      auVar91 = auVar211._0_16_;
                      auVar66._8_8_ = uStack_6c8;
                      auVar66._0_8_ = local_6d0;
                      auVar90 = *(undefined1 (*) [16])(local_6a0.ray + 0x80);
                      uVar83 = vptestmd_avx512vl(auVar66,auVar66);
                      uVar83 = uVar83 & 0xf;
                      auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar11 = (bool)((byte)uVar83 & 1);
                      auVar96._0_4_ = (uint)bVar11 * auVar89._0_4_ | (uint)!bVar11 * auVar90._0_4_;
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      auVar96._4_4_ = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * auVar90._4_4_;
                      bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                      auVar96._8_4_ = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * auVar90._8_4_;
                      bVar11 = SUB81(uVar83 >> 3,0);
                      auVar96._12_4_ =
                           (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * auVar90._12_4_;
                      *(undefined1 (*) [16])(local_6a0.ray + 0x80) = auVar96;
                      pRVar73 = (RayK<4> *)local_6a0.ray;
                      if ((byte)uVar83 != 0) break;
                    }
                    auVar91 = auVar211._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_650;
                    uVar83 = 0;
                    uVar75 = uVar75 ^ 1L << (uVar77 & 0x3f);
                    for (uVar77 = uVar75; (uVar77 & 1) == 0;
                        uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                      uVar83 = uVar83 + 1;
                    }
                    local_660._0_4_ = (int)CONCAT71((int7)((ulong)pRVar73 >> 8),uVar75 != 0);
                  } while (uVar75 != 0);
                  bVar74 = local_660[0] & 1;
                  auVar90 = vxorps_avx512vl(auVar91,auVar91);
                  auVar211 = ZEXT1664(auVar90);
                  auVar207 = ZEXT3264(local_440);
                  auVar208 = ZEXT3264(local_3e0);
                  auVar209 = ZEXT3264(local_460);
                  auVar205 = ZEXT3264(local_5a0);
                  auVar215 = ZEXT3264(local_5c0);
                  auVar212 = ZEXT3264(local_4a0);
                  auVar213 = ZEXT3264(local_4c0);
                  auVar214 = ZEXT3264(local_4e0);
                  auVar112 = vmovdqa64_avx512vl(local_160);
                  auVar201 = ZEXT3264(auVar112);
                }
                bVar79 = (bool)(bVar79 | bVar74);
              }
            }
          }
          lVar81 = lVar81 + 8;
          auVar206 = auVar205;
        } while ((int)lVar81 < iVar7);
      }
      if (bVar79 != false) {
        return local_6e9;
      }
      uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29._4_4_ = uVar139;
      auVar29._0_4_ = uVar139;
      auVar29._8_4_ = uVar139;
      auVar29._12_4_ = uVar139;
      uVar141 = vcmpps_avx512vl(local_170,auVar29,2);
      uVar80 = (uint)uVar82 & (uint)uVar82 + 0xf & (uint)uVar141;
      uVar82 = (ulong)uVar80;
      local_6e9 = uVar80 != 0;
    } while (local_6e9);
  }
  return local_6e9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }